

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiMBIntersectorK<4,4>::
     occluded_h<embree::avx512::RibbonCurve1IntersectorK<embree::HermiteCurveT,4,8>,embree::avx512::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  Primitive PVar7;
  int iVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined8 uVar26;
  long lVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  RayK<4> *pRVar75;
  byte bVar76;
  long lVar77;
  ulong uVar78;
  ulong uVar79;
  Geometry *pGVar80;
  bool bVar81;
  uint uVar82;
  Geometry *geometry;
  long lVar83;
  ulong uVar84;
  ulong uVar85;
  float fVar86;
  float fVar87;
  float fVar133;
  float fVar135;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  float fVar134;
  float fVar136;
  float fVar138;
  float fVar139;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  float fVar137;
  float fVar140;
  float fVar141;
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined4 uVar142;
  undefined8 uVar143;
  vint4 bi_2;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  vint4 bi_1;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  vint4 bi;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar164;
  float fVar170;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  float fVar171;
  float fVar178;
  float fVar179;
  vint4 ai_2;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  float fVar180;
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  vint4 ai_1;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  vint4 ai;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined4 uVar202;
  undefined1 auVar203 [16];
  undefined1 auVar204 [64];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [64];
  undefined1 auVar209 [64];
  undefined1 auVar210 [64];
  undefined1 auVar211 [64];
  undefined1 auVar212 [16];
  undefined1 auVar213 [64];
  undefined1 auVar214 [64];
  undefined1 auVar215 [64];
  undefined1 auVar216 [64];
  undefined1 auVar217 [64];
  undefined1 auVar218 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_8> bhit;
  bool local_6f1;
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  ulong local_6b8;
  Geometry *local_6b0;
  Precalculations *local_6a8;
  RTCFilterFunctionNArguments local_6a0;
  undefined1 local_670 [8];
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [16];
  undefined4 local_650;
  undefined4 uStack_64c;
  undefined8 uStack_648;
  undefined1 local_640 [16];
  undefined1 local_630 [16];
  undefined1 local_620 [16];
  undefined1 local_610 [16];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  float local_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined8 local_5a0;
  undefined8 uStack_598;
  LinearSpace3fa *local_588;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined4 local_540;
  undefined4 uStack_53c;
  undefined4 uStack_538;
  undefined4 uStack_534;
  undefined4 uStack_530;
  undefined4 uStack_52c;
  undefined4 uStack_528;
  undefined4 uStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined8 local_3c0;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined4 local_390;
  undefined4 uStack_38c;
  undefined4 uStack_388;
  undefined4 uStack_384;
  undefined1 local_380 [16];
  undefined1 local_370 [16];
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  undefined4 local_350;
  undefined4 uStack_34c;
  undefined4 uStack_348;
  undefined4 uStack_344;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined1 local_330 [16];
  uint local_320;
  uint uStack_31c;
  uint uStack_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  uint uStack_308;
  uint uStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined4 local_2a0;
  int local_29c;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  byte local_250;
  float local_240 [4];
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined1 local_200 [32];
  uint local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_170 [16];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar7 = prim[1];
  uVar85 = (ulong)(byte)PVar7;
  lVar27 = uVar85 * 0x25;
  fVar171 = *(float *)(prim + lVar27 + 0x12);
  auVar92 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar92 = vinsertps_avx(auVar92,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar91 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar92 = vsubps_avx(auVar92,*(undefined1 (*) [16])(prim + lVar27 + 6));
  auVar165._0_4_ = fVar171 * auVar92._0_4_;
  auVar165._4_4_ = fVar171 * auVar92._4_4_;
  auVar165._8_4_ = fVar171 * auVar92._8_4_;
  auVar165._12_4_ = fVar171 * auVar92._12_4_;
  auVar92 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 4 + 6)));
  auVar144._0_4_ = fVar171 * auVar91._0_4_;
  auVar144._4_4_ = fVar171 * auVar91._4_4_;
  auVar144._8_4_ = fVar171 * auVar91._8_4_;
  auVar144._12_4_ = fVar171 * auVar91._12_4_;
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar91 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 5 + 6)));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar212 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 6 + 6)));
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0xf + 6)));
  auVar212 = vcvtdq2ps_avx(auVar212);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + uVar85 + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0x1a + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0x1b + 6)));
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0x1c + 6)));
  auVar25 = vcvtdq2ps_avx(auVar25);
  auVar181._4_4_ = auVar144._0_4_;
  auVar181._0_4_ = auVar144._0_4_;
  auVar181._8_4_ = auVar144._0_4_;
  auVar181._12_4_ = auVar144._0_4_;
  auVar93 = vshufps_avx(auVar144,auVar144,0x55);
  auVar94 = vshufps_avx(auVar144,auVar144,0xaa);
  fVar171 = auVar94._0_4_;
  auVar159._0_4_ = fVar171 * auVar212._0_4_;
  fVar178 = auVar94._4_4_;
  auVar159._4_4_ = fVar178 * auVar212._4_4_;
  fVar179 = auVar94._8_4_;
  auVar159._8_4_ = fVar179 * auVar212._8_4_;
  fVar180 = auVar94._12_4_;
  auVar159._12_4_ = fVar180 * auVar212._12_4_;
  auVar154._0_4_ = auVar22._0_4_ * fVar171;
  auVar154._4_4_ = auVar22._4_4_ * fVar178;
  auVar154._8_4_ = auVar22._8_4_ * fVar179;
  auVar154._12_4_ = auVar22._12_4_ * fVar180;
  auVar145._0_4_ = auVar25._0_4_ * fVar171;
  auVar145._4_4_ = auVar25._4_4_ * fVar178;
  auVar145._8_4_ = auVar25._8_4_ * fVar179;
  auVar145._12_4_ = auVar25._12_4_ * fVar180;
  auVar94 = vfmadd231ps_fma(auVar159,auVar93,auVar91);
  auVar29 = vfmadd231ps_fma(auVar154,auVar93,auVar21);
  auVar93 = vfmadd231ps_fma(auVar145,auVar24,auVar93);
  auVar95 = vfmadd231ps_fma(auVar94,auVar181,auVar92);
  auVar29 = vfmadd231ps_fma(auVar29,auVar181,auVar20);
  auVar30 = vfmadd231ps_fma(auVar93,auVar23,auVar181);
  auVar203._4_4_ = auVar165._0_4_;
  auVar203._0_4_ = auVar165._0_4_;
  auVar203._8_4_ = auVar165._0_4_;
  auVar203._12_4_ = auVar165._0_4_;
  auVar93 = vshufps_avx(auVar165,auVar165,0x55);
  auVar94 = vshufps_avx(auVar165,auVar165,0xaa);
  fVar171 = auVar94._0_4_;
  auVar182._0_4_ = fVar171 * auVar212._0_4_;
  fVar178 = auVar94._4_4_;
  auVar182._4_4_ = fVar178 * auVar212._4_4_;
  fVar179 = auVar94._8_4_;
  auVar182._8_4_ = fVar179 * auVar212._8_4_;
  fVar180 = auVar94._12_4_;
  auVar182._12_4_ = fVar180 * auVar212._12_4_;
  auVar172._0_4_ = auVar22._0_4_ * fVar171;
  auVar172._4_4_ = auVar22._4_4_ * fVar178;
  auVar172._8_4_ = auVar22._8_4_ * fVar179;
  auVar172._12_4_ = auVar22._12_4_ * fVar180;
  auVar166._0_4_ = auVar25._0_4_ * fVar171;
  auVar166._4_4_ = auVar25._4_4_ * fVar178;
  auVar166._8_4_ = auVar25._8_4_ * fVar179;
  auVar166._12_4_ = auVar25._12_4_ * fVar180;
  auVar91 = vfmadd231ps_fma(auVar182,auVar93,auVar91);
  auVar212 = vfmadd231ps_fma(auVar172,auVar93,auVar21);
  auVar21 = vfmadd231ps_fma(auVar166,auVar93,auVar24);
  auVar31 = vfmadd231ps_fma(auVar91,auVar203,auVar92);
  auVar144 = vfmadd231ps_fma(auVar212,auVar203,auVar20);
  auVar193._8_4_ = 0x7fffffff;
  auVar193._0_8_ = 0x7fffffff7fffffff;
  auVar193._12_4_ = 0x7fffffff;
  auVar145 = vfmadd231ps_fma(auVar21,auVar203,auVar23);
  auVar92 = vandps_avx(auVar193,auVar95);
  auVar190._8_4_ = 0x219392ef;
  auVar190._0_8_ = 0x219392ef219392ef;
  auVar190._12_4_ = 0x219392ef;
  uVar84 = vcmpps_avx512vl(auVar92,auVar190,1);
  bVar81 = (bool)((byte)uVar84 & 1);
  auVar88._0_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar95._0_4_;
  bVar81 = (bool)((byte)(uVar84 >> 1) & 1);
  auVar88._4_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar95._4_4_;
  bVar81 = (bool)((byte)(uVar84 >> 2) & 1);
  auVar88._8_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar95._8_4_;
  bVar81 = (bool)((byte)(uVar84 >> 3) & 1);
  auVar88._12_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar95._12_4_;
  auVar92 = vandps_avx(auVar193,auVar29);
  uVar84 = vcmpps_avx512vl(auVar92,auVar190,1);
  bVar81 = (bool)((byte)uVar84 & 1);
  auVar89._0_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar29._0_4_;
  bVar81 = (bool)((byte)(uVar84 >> 1) & 1);
  auVar89._4_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar29._4_4_;
  bVar81 = (bool)((byte)(uVar84 >> 2) & 1);
  auVar89._8_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar29._8_4_;
  bVar81 = (bool)((byte)(uVar84 >> 3) & 1);
  auVar89._12_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar29._12_4_;
  auVar92 = vandps_avx(auVar193,auVar30);
  uVar84 = vcmpps_avx512vl(auVar92,auVar190,1);
  bVar81 = (bool)((byte)uVar84 & 1);
  auVar90._0_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar30._0_4_;
  bVar81 = (bool)((byte)(uVar84 >> 1) & 1);
  auVar90._4_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar30._4_4_;
  bVar81 = (bool)((byte)(uVar84 >> 2) & 1);
  auVar90._8_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar30._8_4_;
  bVar81 = (bool)((byte)(uVar84 >> 3) & 1);
  auVar90._12_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar30._12_4_;
  auVar91 = vrcp14ps_avx512vl(auVar88);
  auVar191._8_4_ = 0x3f800000;
  auVar191._0_8_ = &DAT_3f8000003f800000;
  auVar191._12_4_ = 0x3f800000;
  auVar92 = vfnmadd213ps_fma(auVar88,auVar91,auVar191);
  auVar95 = vfmadd132ps_fma(auVar92,auVar91,auVar91);
  auVar91 = vrcp14ps_avx512vl(auVar89);
  auVar92 = vfnmadd213ps_fma(auVar89,auVar91,auVar191);
  auVar30 = vfmadd132ps_fma(auVar92,auVar91,auVar91);
  auVar91 = vrcp14ps_avx512vl(auVar90);
  auVar92 = vfnmadd213ps_fma(auVar90,auVar91,auVar191);
  auVar28 = vfmadd132ps_fma(auVar92,auVar91,auVar91);
  fVar171 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar27 + 0x16)) *
            *(float *)(prim + lVar27 + 0x1a);
  auVar188._4_4_ = fVar171;
  auVar188._0_4_ = fVar171;
  auVar188._8_4_ = fVar171;
  auVar188._12_4_ = fVar171;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar85 * 7 + 6);
  auVar92 = vpmovsxwd_avx(auVar92);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + uVar85 * 0xb + 6);
  auVar91 = vpmovsxwd_avx(auVar91);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar20 = vsubps_avx(auVar91,auVar92);
  auVar212._8_8_ = 0;
  auVar212._0_8_ = *(ulong *)(prim + uVar85 * 9 + 6);
  auVar91 = vpmovsxwd_avx(auVar212);
  auVar212 = vfmadd213ps_fma(auVar20,auVar188,auVar92);
  auVar92 = vcvtdq2ps_avx(auVar91);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar85 * 0xd + 6);
  auVar91 = vpmovsxwd_avx(auVar20);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,auVar92);
  auVar20 = vfmadd213ps_fma(auVar91,auVar188,auVar92);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar85 * 0x12 + 6);
  auVar92 = vpmovsxwd_avx(auVar21);
  auVar92 = vcvtdq2ps_avx(auVar92);
  uVar84 = (ulong)(uint)((int)(uVar85 * 5) << 2);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar85 * 2 + uVar84 + 6);
  auVar91 = vpmovsxwd_avx(auVar22);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,auVar92);
  auVar21 = vfmadd213ps_fma(auVar91,auVar188,auVar92);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar84 + 6);
  auVar92 = vpmovsxwd_avx(auVar23);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar85 * 0x18 + 6);
  auVar91 = vpmovsxwd_avx(auVar24);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,auVar92);
  auVar22 = vfmadd213ps_fma(auVar91,auVar188,auVar92);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar85 * 0x1d + 6);
  auVar92 = vpmovsxwd_avx(auVar25);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar85 + (ulong)(byte)PVar7 * 0x20 + 6);
  auVar91 = vpmovsxwd_avx(auVar93);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,auVar92);
  auVar23 = vfmadd213ps_fma(auVar91,auVar188,auVar92);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar7 * 0x20 - uVar85) + 6);
  auVar92 = vpmovsxwd_avx(auVar94);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar85 * 0x23 + 6);
  auVar91 = vpmovsxwd_avx(auVar29);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,auVar92);
  auVar91 = vfmadd213ps_fma(auVar91,auVar188,auVar92);
  auVar92 = vsubps_avx(auVar212,auVar31);
  auVar189._0_4_ = auVar95._0_4_ * auVar92._0_4_;
  auVar189._4_4_ = auVar95._4_4_ * auVar92._4_4_;
  auVar189._8_4_ = auVar95._8_4_ * auVar92._8_4_;
  auVar189._12_4_ = auVar95._12_4_ * auVar92._12_4_;
  auVar92 = vsubps_avx(auVar20,auVar31);
  auVar160._0_4_ = auVar95._0_4_ * auVar92._0_4_;
  auVar160._4_4_ = auVar95._4_4_ * auVar92._4_4_;
  auVar160._8_4_ = auVar95._8_4_ * auVar92._8_4_;
  auVar160._12_4_ = auVar95._12_4_ * auVar92._12_4_;
  auVar92 = vsubps_avx(auVar21,auVar144);
  auVar183._0_4_ = auVar30._0_4_ * auVar92._0_4_;
  auVar183._4_4_ = auVar30._4_4_ * auVar92._4_4_;
  auVar183._8_4_ = auVar30._8_4_ * auVar92._8_4_;
  auVar183._12_4_ = auVar30._12_4_ * auVar92._12_4_;
  auVar92 = vsubps_avx(auVar22,auVar144);
  auVar155._0_4_ = auVar30._0_4_ * auVar92._0_4_;
  auVar155._4_4_ = auVar30._4_4_ * auVar92._4_4_;
  auVar155._8_4_ = auVar30._8_4_ * auVar92._8_4_;
  auVar155._12_4_ = auVar30._12_4_ * auVar92._12_4_;
  auVar92 = vsubps_avx(auVar23,auVar145);
  auVar173._0_4_ = auVar28._0_4_ * auVar92._0_4_;
  auVar173._4_4_ = auVar28._4_4_ * auVar92._4_4_;
  auVar173._8_4_ = auVar28._8_4_ * auVar92._8_4_;
  auVar173._12_4_ = auVar28._12_4_ * auVar92._12_4_;
  auVar92 = vsubps_avx(auVar91,auVar145);
  auVar146._0_4_ = auVar28._0_4_ * auVar92._0_4_;
  auVar146._4_4_ = auVar28._4_4_ * auVar92._4_4_;
  auVar146._8_4_ = auVar28._8_4_ * auVar92._8_4_;
  auVar146._12_4_ = auVar28._12_4_ * auVar92._12_4_;
  auVar92 = vpminsd_avx(auVar189,auVar160);
  auVar91 = vpminsd_avx(auVar183,auVar155);
  auVar92 = vmaxps_avx(auVar92,auVar91);
  auVar91 = vpminsd_avx(auVar173,auVar146);
  uVar142 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar95._4_4_ = uVar142;
  auVar95._0_4_ = uVar142;
  auVar95._8_4_ = uVar142;
  auVar95._12_4_ = uVar142;
  auVar91 = vmaxps_avx512vl(auVar91,auVar95);
  auVar92 = vmaxps_avx(auVar92,auVar91);
  auVar30._8_4_ = 0x3f7ffffa;
  auVar30._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar30._12_4_ = 0x3f7ffffa;
  local_170 = vmulps_avx512vl(auVar92,auVar30);
  auVar92 = vpmaxsd_avx(auVar189,auVar160);
  auVar91 = vpmaxsd_avx(auVar183,auVar155);
  auVar92 = vminps_avx(auVar92,auVar91);
  auVar91 = vpmaxsd_avx(auVar173,auVar146);
  uVar142 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar28._4_4_ = uVar142;
  auVar28._0_4_ = uVar142;
  auVar28._8_4_ = uVar142;
  auVar28._12_4_ = uVar142;
  auVar91 = vminps_avx512vl(auVar91,auVar28);
  auVar92 = vminps_avx(auVar92,auVar91);
  auVar31._8_4_ = 0x3f800003;
  auVar31._0_8_ = 0x3f8000033f800003;
  auVar31._12_4_ = 0x3f800003;
  auVar92 = vmulps_avx512vl(auVar92,auVar31);
  auVar91 = vpbroadcastd_avx512vl();
  uVar143 = vcmpps_avx512vl(local_170,auVar92,2);
  uVar84 = vpcmpgtd_avx512vl(auVar91,_DAT_01ff0cf0);
  uVar84 = ((byte)uVar143 & 0xf) & uVar84;
  local_6f1 = (char)uVar84 != '\0';
  if (local_6f1) {
    local_588 = pre->ray_space + k;
    local_480 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_6a8 = pre;
    do {
      lVar27 = 0;
      for (uVar85 = uVar84; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x8000000000000000) {
        lVar27 = lVar27 + 1;
      }
      local_6b8 = (ulong)*(uint *)(prim + 2);
      pGVar80 = (context->scene->geometries).items[local_6b8].ptr;
      local_620._0_8_ = CONCAT44(0,*(uint *)(prim + lVar27 * 4 + 6));
      uVar85 = (ulong)*(uint *)(*(long *)&pGVar80->field_0x58 +
                               CONCAT44(0,*(uint *)(prim + lVar27 * 4 + 6)) *
                               pGVar80[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar171 = (pGVar80->time_range).lower;
      fVar171 = pGVar80->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x70) - fVar171) /
                ((pGVar80->time_range).upper - fVar171));
      auVar92 = vroundss_avx(ZEXT416((uint)fVar171),ZEXT416((uint)fVar171),9);
      auVar92 = vminss_avx(auVar92,ZEXT416((uint)(pGVar80->fnumTimeSegments + -1.0)));
      auVar92 = vmaxss_avx(ZEXT816(0) << 0x20,auVar92);
      fVar171 = fVar171 - auVar92._0_4_;
      fVar178 = 1.0 - fVar171;
      _Var9 = pGVar80[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar77 = (long)(int)auVar92._0_4_ * 0x38;
      lVar83 = *(long *)(_Var9 + 0x10 + lVar77);
      lVar10 = *(long *)(_Var9 + 0x38 + lVar77);
      lVar11 = *(long *)(_Var9 + 0x48 + lVar77);
      auVar147._4_4_ = fVar171;
      auVar147._0_4_ = fVar171;
      auVar147._8_4_ = fVar171;
      auVar147._12_4_ = fVar171;
      pfVar3 = (float *)(lVar10 + lVar11 * uVar85);
      auVar194._0_4_ = fVar171 * *pfVar3;
      auVar194._4_4_ = fVar171 * pfVar3[1];
      auVar194._8_4_ = fVar171 * pfVar3[2];
      auVar194._12_4_ = fVar171 * pfVar3[3];
      lVar27 = uVar85 + 1;
      auVar92 = vmulps_avx512vl(auVar147,*(undefined1 (*) [16])(lVar10 + lVar11 * lVar27));
      p_Var12 = pGVar80[4].occlusionFilterN;
      auVar156._4_4_ = fVar178;
      auVar156._0_4_ = fVar178;
      auVar156._8_4_ = fVar178;
      auVar156._12_4_ = fVar178;
      local_610 = vfmadd231ps_fma(auVar194,auVar156,
                                  *(undefined1 (*) [16])
                                   (*(long *)(_Var9 + lVar77) + lVar83 * uVar85));
      local_450 = vfmadd231ps_avx512vl
                            (auVar92,auVar156,
                             *(undefined1 (*) [16])(*(long *)(_Var9 + lVar77) + lVar83 * lVar27));
      pfVar3 = (float *)(*(long *)(p_Var12 + lVar77 + 0x38) +
                        uVar85 * *(long *)(p_Var12 + lVar77 + 0x48));
      auVar195._0_4_ = fVar171 * *pfVar3;
      auVar195._4_4_ = fVar171 * pfVar3[1];
      auVar195._8_4_ = fVar171 * pfVar3[2];
      auVar195._12_4_ = fVar171 * pfVar3[3];
      pfVar3 = (float *)(*(long *)(p_Var12 + lVar77 + 0x38) +
                        *(long *)(p_Var12 + lVar77 + 0x48) * lVar27);
      auVar198._0_4_ = fVar171 * *pfVar3;
      auVar198._4_4_ = fVar171 * pfVar3[1];
      auVar198._8_4_ = fVar171 * pfVar3[2];
      auVar198._12_4_ = fVar171 * pfVar3[3];
      auVar91 = vfmadd231ps_fma(auVar195,auVar156,
                                *(undefined1 (*) [16])
                                 (*(long *)(p_Var12 + lVar77) +
                                 *(long *)(p_Var12 + lVar77 + 0x10) * uVar85));
      auVar212 = vfmadd231ps_fma(auVar198,auVar156,
                                 *(undefined1 (*) [16])
                                  (*(long *)(p_Var12 + lVar77) +
                                  *(long *)(p_Var12 + lVar77 + 0x10) * lVar27));
      iVar8 = (int)pGVar80[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar92 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10))
                              ,0x1c);
      auVar92 = vinsertps_avx(auVar92,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      lVar27 = (long)iVar8 * 0x44;
      auVar157._8_4_ = 0xbeaaaaab;
      auVar157._0_8_ = 0xbeaaaaabbeaaaaab;
      auVar157._12_4_ = 0xbeaaaaab;
      local_460 = vfnmadd213ps_fma(auVar91,auVar157,local_610);
      local_470 = vfmadd213ps_avx512vl(auVar212,auVar157,local_450);
      auVar212 = vsubps_avx(local_610,auVar92);
      uVar142 = auVar212._0_4_;
      auVar161._4_4_ = uVar142;
      auVar161._0_4_ = uVar142;
      auVar161._8_4_ = uVar142;
      auVar161._12_4_ = uVar142;
      auVar91 = vshufps_avx(auVar212,auVar212,0x55);
      aVar5 = (local_588->vx).field_0;
      aVar6 = (local_588->vy).field_0;
      fVar171 = (local_588->vz).field_0.m128[0];
      fVar178 = *(float *)((long)&(local_588->vz).field_0 + 4);
      fVar179 = *(float *)((long)&(local_588->vz).field_0 + 8);
      fVar180 = *(float *)((long)&(local_588->vz).field_0 + 0xc);
      auVar212 = vshufps_avx(auVar212,auVar212,0xaa);
      auVar197._0_4_ = fVar171 * auVar212._0_4_;
      auVar197._4_4_ = fVar178 * auVar212._4_4_;
      auVar197._8_4_ = fVar179 * auVar212._8_4_;
      auVar197._12_4_ = fVar180 * auVar212._12_4_;
      auVar91 = vfmadd231ps_fma(auVar197,(undefined1  [16])aVar6,auVar91);
      auVar20 = vfmadd231ps_fma(auVar91,(undefined1  [16])aVar5,auVar161);
      auVar212 = vsubps_avx(local_460,auVar92);
      uVar142 = auVar212._0_4_;
      auVar162._4_4_ = uVar142;
      auVar162._0_4_ = uVar142;
      auVar162._8_4_ = uVar142;
      auVar162._12_4_ = uVar142;
      auVar91 = vshufps_avx(auVar212,auVar212,0x55);
      auVar212 = vshufps_avx(auVar212,auVar212,0xaa);
      auVar199._0_4_ = fVar171 * auVar212._0_4_;
      auVar199._4_4_ = fVar178 * auVar212._4_4_;
      auVar199._8_4_ = fVar179 * auVar212._8_4_;
      auVar199._12_4_ = fVar180 * auVar212._12_4_;
      auVar91 = vfmadd231ps_fma(auVar199,(undefined1  [16])aVar6,auVar91);
      auVar21 = vfmadd231ps_fma(auVar91,(undefined1  [16])aVar5,auVar162);
      auVar212 = vsubps_avx(local_470,auVar92);
      uVar142 = auVar212._0_4_;
      auVar163._4_4_ = uVar142;
      auVar163._0_4_ = uVar142;
      auVar163._8_4_ = uVar142;
      auVar163._12_4_ = uVar142;
      auVar91 = vshufps_avx(auVar212,auVar212,0x55);
      auVar212 = vshufps_avx(auVar212,auVar212,0xaa);
      auVar200._0_4_ = fVar171 * auVar212._0_4_;
      auVar200._4_4_ = fVar178 * auVar212._4_4_;
      auVar200._8_4_ = fVar179 * auVar212._8_4_;
      auVar200._12_4_ = fVar180 * auVar212._12_4_;
      auVar91 = vfmadd231ps_fma(auVar200,(undefined1  [16])aVar6,auVar91);
      auVar212 = vfmadd231ps_fma(auVar91,(undefined1  [16])aVar5,auVar163);
      auVar91 = vsubps_avx512vl(local_450,auVar92);
      uVar142 = auVar91._0_4_;
      auVar158._4_4_ = uVar142;
      auVar158._0_4_ = uVar142;
      auVar158._8_4_ = uVar142;
      auVar158._12_4_ = uVar142;
      auVar92 = vshufps_avx(auVar91,auVar91,0x55);
      auVar91 = vshufps_avx(auVar91,auVar91,0xaa);
      auVar205._0_4_ = fVar171 * auVar91._0_4_;
      auVar205._4_4_ = fVar178 * auVar91._4_4_;
      auVar205._8_4_ = fVar179 * auVar91._8_4_;
      auVar205._12_4_ = fVar180 * auVar91._12_4_;
      auVar92 = vfmadd231ps_fma(auVar205,(undefined1  [16])aVar6,auVar92);
      auVar22 = vfmadd231ps_fma(auVar92,(undefined1  [16])aVar5,auVar158);
      auVar113 = *(undefined1 (*) [32])(bezier_basis0 + lVar27);
      uVar142 = auVar20._0_4_;
      local_4a0._4_4_ = uVar142;
      local_4a0._0_4_ = uVar142;
      local_4a0._8_4_ = uVar142;
      local_4a0._12_4_ = uVar142;
      local_4a0._16_4_ = uVar142;
      local_4a0._20_4_ = uVar142;
      local_4a0._24_4_ = uVar142;
      local_4a0._28_4_ = uVar142;
      auVar115 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x484);
      auVar98._8_4_ = 1;
      auVar98._0_8_ = 0x100000001;
      auVar98._12_4_ = 1;
      auVar98._16_4_ = 1;
      auVar98._20_4_ = 1;
      auVar98._24_4_ = 1;
      auVar98._28_4_ = 1;
      local_3e0 = vpermps_avx2(auVar98,ZEXT1632(auVar20));
      local_4c0 = vbroadcastss_avx512vl(auVar21);
      local_400 = vpermps_avx512vl(auVar98,ZEXT1632(auVar21));
      auVar111 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x908);
      local_4e0 = vbroadcastss_avx512vl(auVar212);
      local_500 = vpermps_avx512vl(auVar98,ZEXT1632(auVar212));
      auVar110 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0xd8c);
      uVar142 = auVar22._0_4_;
      local_420._4_4_ = uVar142;
      local_420._0_4_ = uVar142;
      local_420._8_4_ = uVar142;
      local_420._12_4_ = uVar142;
      local_420._16_4_ = uVar142;
      local_420._20_4_ = uVar142;
      local_420._24_4_ = uVar142;
      local_420._28_4_ = uVar142;
      local_440 = vpermps_avx2(auVar98,ZEXT1632(auVar22));
      auVar98 = vmulps_avx512vl(local_420,auVar110);
      auVar99 = vmulps_avx512vl(local_440,auVar110);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar111,local_4e0);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar111,local_500);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar115,local_4c0);
      auVar100 = vfmadd231ps_avx512vl(auVar99,auVar115,local_400);
      auVar101 = vfmadd231ps_avx512vl(auVar98,auVar113,local_4a0);
      auVar98 = *(undefined1 (*) [32])(bezier_basis1 + lVar27);
      auVar99 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x484);
      auVar109 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x908);
      auVar102 = vfmadd231ps_avx512vl(auVar100,auVar113,local_3e0);
      auVar100 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0xd8c);
      auVar216 = ZEXT3264(local_420);
      auVar103 = vmulps_avx512vl(local_420,auVar100);
      auVar217 = ZEXT3264(local_440);
      auVar104 = vmulps_avx512vl(local_440,auVar100);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar109,local_4e0);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar109,local_500);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar99,local_4c0);
      auVar218 = ZEXT3264(local_400);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar99,local_400);
      auVar23 = vfmadd231ps_fma(auVar103,auVar98,local_4a0);
      auVar24 = vfmadd231ps_fma(auVar104,auVar98,local_3e0);
      auVar104 = vsubps_avx512vl(ZEXT1632(auVar23),auVar101);
      auVar105 = vsubps_avx512vl(ZEXT1632(auVar24),auVar102);
      auVar103 = vmulps_avx512vl(auVar102,auVar104);
      auVar106 = vmulps_avx512vl(auVar101,auVar105);
      auVar103 = vsubps_avx512vl(auVar103,auVar106);
      auVar92 = vshufps_avx(local_610,local_610,0xff);
      uVar143 = auVar92._0_8_;
      local_80._8_8_ = uVar143;
      local_80._0_8_ = uVar143;
      local_80._16_8_ = uVar143;
      local_80._24_8_ = uVar143;
      auVar92 = vshufps_avx(local_460,local_460,0xff);
      local_a0 = vbroadcastsd_avx512vl(auVar92);
      auVar92 = vshufps_avx(local_470,local_470,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar92);
      auVar92 = vshufps_avx512vl(local_450,local_450,0xff);
      uVar143 = auVar92._0_8_;
      register0x00001248 = uVar143;
      local_e0 = uVar143;
      register0x00001250 = uVar143;
      register0x00001258 = uVar143;
      auVar106 = vmulps_avx512vl(_local_e0,auVar110);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar111,local_c0);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar115,local_a0);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar113,local_80);
      auVar107 = vmulps_avx512vl(_local_e0,auVar100);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar109,local_c0);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar99,local_a0);
      auVar25 = vfmadd231ps_fma(auVar107,auVar98,local_80);
      auVar107 = vmulps_avx512vl(auVar105,auVar105);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar104,auVar104);
      auVar108 = vmaxps_avx512vl(auVar106,ZEXT1632(auVar25));
      auVar108 = vmulps_avx512vl(auVar108,auVar108);
      auVar107 = vmulps_avx512vl(auVar108,auVar107);
      auVar103 = vmulps_avx512vl(auVar103,auVar103);
      uVar143 = vcmpps_avx512vl(auVar103,auVar107,2);
      auVar92 = vblendps_avx(auVar20,local_610,8);
      auVar93 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar91 = vandps_avx512vl(auVar92,auVar93);
      auVar92 = vblendps_avx(auVar21,local_460,8);
      auVar92 = vandps_avx512vl(auVar92,auVar93);
      auVar91 = vmaxps_avx(auVar91,auVar92);
      auVar92 = vblendps_avx(auVar212,local_470,8);
      auVar94 = vandps_avx512vl(auVar92,auVar93);
      auVar92 = vblendps_avx(auVar22,local_450,8);
      auVar92 = vandps_avx512vl(auVar92,auVar93);
      auVar92 = vmaxps_avx(auVar94,auVar92);
      auVar92 = vmaxps_avx(auVar91,auVar92);
      auVar91 = vmovshdup_avx(auVar92);
      auVar91 = vmaxss_avx(auVar91,auVar92);
      auVar92 = vshufpd_avx(auVar92,auVar92,1);
      auVar92 = vmaxss_avx(auVar92,auVar91);
      local_630 = vcvtsi2ss_avx512f(local_450,iVar8);
      auVar107._0_4_ = local_630._0_4_;
      auVar107._4_4_ = auVar107._0_4_;
      auVar107._8_4_ = auVar107._0_4_;
      auVar107._12_4_ = auVar107._0_4_;
      auVar107._16_4_ = auVar107._0_4_;
      auVar107._20_4_ = auVar107._0_4_;
      auVar107._24_4_ = auVar107._0_4_;
      auVar107._28_4_ = auVar107._0_4_;
      uVar26 = vcmpps_avx512vl(auVar107,_DAT_02020f40,0xe);
      local_250 = (byte)uVar143 & (byte)uVar26;
      _local_670 = vmulss_avx512f(auVar92,ZEXT416(0x35000000));
      auVar103._8_4_ = 2;
      auVar103._0_8_ = 0x200000002;
      auVar103._12_4_ = 2;
      auVar103._16_4_ = 2;
      auVar103._20_4_ = 2;
      auVar103._24_4_ = 2;
      auVar103._28_4_ = 2;
      local_100 = vpermps_avx512vl(auVar103,ZEXT1632(auVar20));
      local_120 = vpermps_avx512vl(auVar103,ZEXT1632(auVar21));
      local_140 = vpermps_avx512vl(auVar103,ZEXT1632(auVar212));
      auVar103 = vpermps_avx2(auVar103,ZEXT1632(auVar22));
      uVar142 = *(undefined4 *)(ray + k * 4 + 0x30);
      auVar92 = auVar105._0_16_;
      uVar202 = local_670._0_4_;
      if (local_250 == 0) {
        bVar81 = false;
        auVar92 = vxorps_avx512vl(auVar92,auVar92);
        auVar213 = ZEXT1664(auVar92);
        auVar209 = ZEXT3264(local_4a0);
        auVar210 = ZEXT3264(local_3e0);
        auVar211 = ZEXT3264(local_4c0);
        auVar214 = ZEXT3264(local_4e0);
        auVar215 = ZEXT3264(local_500);
      }
      else {
        uStack_53c = 0;
        uStack_538 = 0;
        uStack_534 = 0;
        auVar100 = vmulps_avx512vl(auVar103,auVar100);
        auVar109 = vfmadd213ps_avx512vl(auVar109,local_140,auVar100);
        auVar99 = vfmadd213ps_avx512vl(auVar99,local_120,auVar109);
        auVar108 = vfmadd213ps_avx512vl(auVar98,local_100,auVar99);
        auVar110 = vmulps_avx512vl(auVar103,auVar110);
        auVar111 = vfmadd213ps_avx512vl(auVar111,local_140,auVar110);
        auVar99 = vfmadd213ps_avx512vl(auVar115,local_120,auVar111);
        auVar115 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x1210);
        auVar111 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x1694);
        auVar110 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x1b18);
        auVar98 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x1f9c);
        auVar112 = vfmadd213ps_avx512vl(auVar113,local_100,auVar99);
        auVar113 = vmulps_avx512vl(local_420,auVar98);
        auVar99 = vmulps_avx512vl(local_440,auVar98);
        auVar201._0_4_ = auVar103._0_4_ * auVar98._0_4_;
        auVar201._4_4_ = auVar103._4_4_ * auVar98._4_4_;
        auVar201._8_4_ = auVar103._8_4_ * auVar98._8_4_;
        auVar201._12_4_ = auVar103._12_4_ * auVar98._12_4_;
        auVar201._16_4_ = auVar103._16_4_ * auVar98._16_4_;
        auVar201._20_4_ = auVar103._20_4_ * auVar98._20_4_;
        auVar201._24_4_ = auVar103._24_4_ * auVar98._24_4_;
        auVar201._28_4_ = 0;
        auVar113 = vfmadd231ps_avx512vl(auVar113,auVar110,local_4e0);
        auVar98 = vfmadd231ps_avx512vl(auVar99,auVar110,local_500);
        auVar110 = vfmadd231ps_avx512vl(auVar201,local_140,auVar110);
        auVar113 = vfmadd231ps_avx512vl(auVar113,auVar111,local_4c0);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar111,local_400);
        auVar99 = vfmadd231ps_avx512vl(auVar110,local_120,auVar111);
        auVar109 = vfmadd231ps_avx512vl(auVar113,auVar115,local_4a0);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar115,local_3e0);
        auVar113 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x1210);
        auVar111 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x1b18);
        auVar110 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x1f9c);
        auVar99 = vfmadd231ps_avx512vl(auVar99,local_100,auVar115);
        auVar100 = vmulps_avx512vl(local_420,auVar110);
        auVar114 = vmulps_avx512vl(local_440,auVar110);
        auVar115._4_4_ = auVar103._4_4_ * auVar110._4_4_;
        auVar115._0_4_ = auVar103._0_4_ * auVar110._0_4_;
        auVar115._8_4_ = auVar103._8_4_ * auVar110._8_4_;
        auVar115._12_4_ = auVar103._12_4_ * auVar110._12_4_;
        auVar115._16_4_ = auVar103._16_4_ * auVar110._16_4_;
        auVar115._20_4_ = auVar103._20_4_ * auVar110._20_4_;
        auVar115._24_4_ = auVar103._24_4_ * auVar110._24_4_;
        auVar115._28_4_ = auVar110._28_4_;
        auVar110 = vfmadd231ps_avx512vl(auVar100,auVar111,local_4e0);
        auVar100 = vfmadd231ps_avx512vl(auVar114,auVar111,local_500);
        auVar111 = vfmadd231ps_avx512vl(auVar115,local_140,auVar111);
        auVar115 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x1694);
        auVar110 = vfmadd231ps_avx512vl(auVar110,auVar115,local_4c0);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar115,local_400);
        auVar115 = vfmadd231ps_avx512vl(auVar111,local_120,auVar115);
        auVar111 = vfmadd231ps_avx512vl(auVar110,auVar113,local_4a0);
        auVar110 = vfmadd231ps_avx512vl(auVar100,auVar113,local_3e0);
        auVar100 = vfmadd231ps_avx512vl(auVar115,local_100,auVar113);
        auVar206._8_4_ = 0x7fffffff;
        auVar206._0_8_ = 0x7fffffff7fffffff;
        auVar206._12_4_ = 0x7fffffff;
        auVar206._16_4_ = 0x7fffffff;
        auVar206._20_4_ = 0x7fffffff;
        auVar206._24_4_ = 0x7fffffff;
        auVar206._28_4_ = 0x7fffffff;
        auVar113 = vandps_avx(auVar109,auVar206);
        auVar115 = vandps_avx(auVar98,auVar206);
        auVar115 = vmaxps_avx(auVar113,auVar115);
        auVar113 = vandps_avx(auVar99,auVar206);
        auVar113 = vmaxps_avx(auVar115,auVar113);
        auVar99 = vbroadcastss_avx512vl(_local_670);
        uVar85 = vcmpps_avx512vl(auVar113,auVar99,1);
        bVar81 = (bool)((byte)uVar85 & 1);
        auVar114._0_4_ = (float)((uint)bVar81 * auVar104._0_4_ | (uint)!bVar81 * auVar109._0_4_);
        bVar81 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar114._4_4_ = (float)((uint)bVar81 * auVar104._4_4_ | (uint)!bVar81 * auVar109._4_4_);
        bVar81 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar114._8_4_ = (float)((uint)bVar81 * auVar104._8_4_ | (uint)!bVar81 * auVar109._8_4_);
        bVar81 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar114._12_4_ = (float)((uint)bVar81 * auVar104._12_4_ | (uint)!bVar81 * auVar109._12_4_);
        bVar81 = (bool)((byte)(uVar85 >> 4) & 1);
        auVar114._16_4_ = (float)((uint)bVar81 * auVar104._16_4_ | (uint)!bVar81 * auVar109._16_4_);
        bVar81 = (bool)((byte)(uVar85 >> 5) & 1);
        auVar114._20_4_ = (float)((uint)bVar81 * auVar104._20_4_ | (uint)!bVar81 * auVar109._20_4_);
        bVar81 = (bool)((byte)(uVar85 >> 6) & 1);
        auVar114._24_4_ = (float)((uint)bVar81 * auVar104._24_4_ | (uint)!bVar81 * auVar109._24_4_);
        bVar81 = SUB81(uVar85 >> 7,0);
        auVar114._28_4_ = (uint)bVar81 * auVar104._28_4_ | (uint)!bVar81 * auVar109._28_4_;
        bVar81 = (bool)((byte)uVar85 & 1);
        auVar116._0_4_ = (float)((uint)bVar81 * auVar105._0_4_ | (uint)!bVar81 * auVar98._0_4_);
        bVar81 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar116._4_4_ = (float)((uint)bVar81 * auVar105._4_4_ | (uint)!bVar81 * auVar98._4_4_);
        bVar81 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar116._8_4_ = (float)((uint)bVar81 * auVar105._8_4_ | (uint)!bVar81 * auVar98._8_4_);
        bVar81 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar116._12_4_ = (float)((uint)bVar81 * auVar105._12_4_ | (uint)!bVar81 * auVar98._12_4_);
        bVar81 = (bool)((byte)(uVar85 >> 4) & 1);
        auVar116._16_4_ = (float)((uint)bVar81 * auVar105._16_4_ | (uint)!bVar81 * auVar98._16_4_);
        bVar81 = (bool)((byte)(uVar85 >> 5) & 1);
        auVar116._20_4_ = (float)((uint)bVar81 * auVar105._20_4_ | (uint)!bVar81 * auVar98._20_4_);
        bVar81 = (bool)((byte)(uVar85 >> 6) & 1);
        auVar116._24_4_ = (float)((uint)bVar81 * auVar105._24_4_ | (uint)!bVar81 * auVar98._24_4_);
        bVar81 = SUB81(uVar85 >> 7,0);
        auVar116._28_4_ = (uint)bVar81 * auVar105._28_4_ | (uint)!bVar81 * auVar98._28_4_;
        auVar113 = vandps_avx(auVar206,auVar111);
        auVar115 = vandps_avx(auVar110,auVar206);
        auVar115 = vmaxps_avx(auVar113,auVar115);
        auVar113 = vandps_avx(auVar100,auVar206);
        auVar113 = vmaxps_avx(auVar115,auVar113);
        uVar85 = vcmpps_avx512vl(auVar113,auVar99,1);
        bVar81 = (bool)((byte)uVar85 & 1);
        auVar117._0_4_ = (float)((uint)bVar81 * auVar104._0_4_ | (uint)!bVar81 * auVar111._0_4_);
        bVar81 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar117._4_4_ = (float)((uint)bVar81 * auVar104._4_4_ | (uint)!bVar81 * auVar111._4_4_);
        bVar81 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar117._8_4_ = (float)((uint)bVar81 * auVar104._8_4_ | (uint)!bVar81 * auVar111._8_4_);
        bVar81 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar117._12_4_ = (float)((uint)bVar81 * auVar104._12_4_ | (uint)!bVar81 * auVar111._12_4_);
        bVar81 = (bool)((byte)(uVar85 >> 4) & 1);
        auVar117._16_4_ = (float)((uint)bVar81 * auVar104._16_4_ | (uint)!bVar81 * auVar111._16_4_);
        bVar81 = (bool)((byte)(uVar85 >> 5) & 1);
        auVar117._20_4_ = (float)((uint)bVar81 * auVar104._20_4_ | (uint)!bVar81 * auVar111._20_4_);
        bVar81 = (bool)((byte)(uVar85 >> 6) & 1);
        auVar117._24_4_ = (float)((uint)bVar81 * auVar104._24_4_ | (uint)!bVar81 * auVar111._24_4_);
        bVar81 = SUB81(uVar85 >> 7,0);
        auVar117._28_4_ = (uint)bVar81 * auVar104._28_4_ | (uint)!bVar81 * auVar111._28_4_;
        bVar81 = (bool)((byte)uVar85 & 1);
        auVar118._0_4_ = (float)((uint)bVar81 * auVar105._0_4_ | (uint)!bVar81 * auVar110._0_4_);
        bVar81 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar118._4_4_ = (float)((uint)bVar81 * auVar105._4_4_ | (uint)!bVar81 * auVar110._4_4_);
        bVar81 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar118._8_4_ = (float)((uint)bVar81 * auVar105._8_4_ | (uint)!bVar81 * auVar110._8_4_);
        bVar81 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar118._12_4_ = (float)((uint)bVar81 * auVar105._12_4_ | (uint)!bVar81 * auVar110._12_4_);
        bVar81 = (bool)((byte)(uVar85 >> 4) & 1);
        auVar118._16_4_ = (float)((uint)bVar81 * auVar105._16_4_ | (uint)!bVar81 * auVar110._16_4_);
        bVar81 = (bool)((byte)(uVar85 >> 5) & 1);
        auVar118._20_4_ = (float)((uint)bVar81 * auVar105._20_4_ | (uint)!bVar81 * auVar110._20_4_);
        bVar81 = (bool)((byte)(uVar85 >> 6) & 1);
        auVar118._24_4_ = (float)((uint)bVar81 * auVar105._24_4_ | (uint)!bVar81 * auVar110._24_4_);
        bVar81 = SUB81(uVar85 >> 7,0);
        auVar118._28_4_ = (uint)bVar81 * auVar105._28_4_ | (uint)!bVar81 * auVar110._28_4_;
        auVar95 = vxorps_avx512vl(auVar92,auVar92);
        auVar213 = ZEXT1664(auVar95);
        auVar113 = vfmadd213ps_avx512vl(auVar114,auVar114,ZEXT1632(auVar95));
        auVar92 = vfmadd231ps_fma(auVar113,auVar116,auVar116);
        auVar115 = vrsqrt14ps_avx512vl(ZEXT1632(auVar92));
        fVar171 = auVar115._0_4_;
        fVar178 = auVar115._4_4_;
        fVar179 = auVar115._8_4_;
        fVar180 = auVar115._12_4_;
        fVar164 = auVar115._16_4_;
        fVar170 = auVar115._20_4_;
        fVar86 = auVar115._24_4_;
        auVar113._4_4_ = fVar178 * fVar178 * fVar178 * auVar92._4_4_ * -0.5;
        auVar113._0_4_ = fVar171 * fVar171 * fVar171 * auVar92._0_4_ * -0.5;
        auVar113._8_4_ = fVar179 * fVar179 * fVar179 * auVar92._8_4_ * -0.5;
        auVar113._12_4_ = fVar180 * fVar180 * fVar180 * auVar92._12_4_ * -0.5;
        auVar113._16_4_ = fVar164 * fVar164 * fVar164 * -0.0;
        auVar113._20_4_ = fVar170 * fVar170 * fVar170 * -0.0;
        auVar113._24_4_ = fVar86 * fVar86 * fVar86 * -0.0;
        auVar113._28_4_ = auVar100._28_4_;
        auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar113 = vfmadd231ps_avx512vl(auVar113,auVar98,auVar115);
        auVar111._4_4_ = auVar116._4_4_ * auVar113._4_4_;
        auVar111._0_4_ = auVar116._0_4_ * auVar113._0_4_;
        auVar111._8_4_ = auVar116._8_4_ * auVar113._8_4_;
        auVar111._12_4_ = auVar116._12_4_ * auVar113._12_4_;
        auVar111._16_4_ = auVar116._16_4_ * auVar113._16_4_;
        auVar111._20_4_ = auVar116._20_4_ * auVar113._20_4_;
        auVar111._24_4_ = auVar116._24_4_ * auVar113._24_4_;
        auVar111._28_4_ = 0;
        auVar110._4_4_ = auVar113._4_4_ * -auVar114._4_4_;
        auVar110._0_4_ = auVar113._0_4_ * -auVar114._0_4_;
        auVar110._8_4_ = auVar113._8_4_ * -auVar114._8_4_;
        auVar110._12_4_ = auVar113._12_4_ * -auVar114._12_4_;
        auVar110._16_4_ = auVar113._16_4_ * -auVar114._16_4_;
        auVar110._20_4_ = auVar113._20_4_ * -auVar114._20_4_;
        auVar110._24_4_ = auVar113._24_4_ * -auVar114._24_4_;
        auVar110._28_4_ = auVar116._28_4_;
        auVar113 = vmulps_avx512vl(auVar113,ZEXT1632(auVar95));
        auVar104 = ZEXT1632(auVar95);
        auVar115 = vfmadd213ps_avx512vl(auVar117,auVar117,auVar104);
        auVar92 = vfmadd231ps_fma(auVar115,auVar118,auVar118);
        auVar115 = vrsqrt14ps_avx512vl(ZEXT1632(auVar92));
        fVar171 = auVar115._0_4_;
        fVar178 = auVar115._4_4_;
        fVar179 = auVar115._8_4_;
        fVar180 = auVar115._12_4_;
        fVar164 = auVar115._16_4_;
        fVar170 = auVar115._20_4_;
        fVar86 = auVar115._24_4_;
        auVar99._4_4_ = fVar178 * fVar178 * fVar178 * auVar92._4_4_ * -0.5;
        auVar99._0_4_ = fVar171 * fVar171 * fVar171 * auVar92._0_4_ * -0.5;
        auVar99._8_4_ = fVar179 * fVar179 * fVar179 * auVar92._8_4_ * -0.5;
        auVar99._12_4_ = fVar180 * fVar180 * fVar180 * auVar92._12_4_ * -0.5;
        auVar99._16_4_ = fVar164 * fVar164 * fVar164 * -0.0;
        auVar99._20_4_ = fVar170 * fVar170 * fVar170 * -0.0;
        auVar99._24_4_ = fVar86 * fVar86 * fVar86 * -0.0;
        auVar99._28_4_ = 0;
        auVar98 = vfmadd231ps_avx512vl(auVar99,auVar98,auVar115);
        auVar109._4_4_ = auVar118._4_4_ * auVar98._4_4_;
        auVar109._0_4_ = auVar118._0_4_ * auVar98._0_4_;
        auVar109._8_4_ = auVar118._8_4_ * auVar98._8_4_;
        auVar109._12_4_ = auVar118._12_4_ * auVar98._12_4_;
        auVar109._16_4_ = auVar118._16_4_ * auVar98._16_4_;
        auVar109._20_4_ = auVar118._20_4_ * auVar98._20_4_;
        auVar109._24_4_ = auVar118._24_4_ * auVar98._24_4_;
        auVar109._28_4_ = auVar115._28_4_;
        auVar100._4_4_ = -auVar117._4_4_ * auVar98._4_4_;
        auVar100._0_4_ = -auVar117._0_4_ * auVar98._0_4_;
        auVar100._8_4_ = -auVar117._8_4_ * auVar98._8_4_;
        auVar100._12_4_ = -auVar117._12_4_ * auVar98._12_4_;
        auVar100._16_4_ = -auVar117._16_4_ * auVar98._16_4_;
        auVar100._20_4_ = -auVar117._20_4_ * auVar98._20_4_;
        auVar100._24_4_ = -auVar117._24_4_ * auVar98._24_4_;
        auVar100._28_4_ = auVar117._28_4_ ^ 0x80000000;
        auVar115 = vmulps_avx512vl(auVar98,auVar104);
        auVar92 = vfmadd213ps_fma(auVar111,auVar106,auVar101);
        auVar91 = vfmadd213ps_fma(auVar110,auVar106,auVar102);
        auVar98 = vfmadd213ps_avx512vl(auVar113,auVar106,auVar112);
        auVar99 = vfmadd213ps_avx512vl(auVar109,ZEXT1632(auVar25),ZEXT1632(auVar23));
        auVar93 = vfnmadd213ps_fma(auVar111,auVar106,auVar101);
        auVar101 = ZEXT1632(auVar25);
        auVar212 = vfmadd213ps_fma(auVar100,auVar101,ZEXT1632(auVar24));
        auVar94 = vfnmadd213ps_fma(auVar110,auVar106,auVar102);
        auVar20 = vfmadd213ps_fma(auVar115,auVar101,auVar108);
        auVar111 = vfnmadd231ps_avx512vl(auVar112,auVar106,auVar113);
        auVar23 = vfnmadd213ps_fma(auVar109,auVar101,ZEXT1632(auVar23));
        auVar24 = vfnmadd213ps_fma(auVar100,auVar101,ZEXT1632(auVar24));
        auVar29 = vfnmadd231ps_fma(auVar108,ZEXT1632(auVar25),auVar115);
        auVar115 = vsubps_avx512vl(auVar99,ZEXT1632(auVar93));
        auVar113 = vsubps_avx(ZEXT1632(auVar212),ZEXT1632(auVar94));
        auVar110 = vsubps_avx512vl(ZEXT1632(auVar20),auVar111);
        auVar109 = vmulps_avx512vl(auVar113,auVar111);
        auVar21 = vfmsub231ps_fma(auVar109,ZEXT1632(auVar94),auVar110);
        auVar101._4_4_ = auVar93._4_4_ * auVar110._4_4_;
        auVar101._0_4_ = auVar93._0_4_ * auVar110._0_4_;
        auVar101._8_4_ = auVar93._8_4_ * auVar110._8_4_;
        auVar101._12_4_ = auVar93._12_4_ * auVar110._12_4_;
        auVar101._16_4_ = auVar110._16_4_ * 0.0;
        auVar101._20_4_ = auVar110._20_4_ * 0.0;
        auVar101._24_4_ = auVar110._24_4_ * 0.0;
        auVar101._28_4_ = auVar110._28_4_;
        auVar110 = vfmsub231ps_avx512vl(auVar101,auVar111,auVar115);
        auVar102._4_4_ = auVar94._4_4_ * auVar115._4_4_;
        auVar102._0_4_ = auVar94._0_4_ * auVar115._0_4_;
        auVar102._8_4_ = auVar94._8_4_ * auVar115._8_4_;
        auVar102._12_4_ = auVar94._12_4_ * auVar115._12_4_;
        auVar102._16_4_ = auVar115._16_4_ * 0.0;
        auVar102._20_4_ = auVar115._20_4_ * 0.0;
        auVar102._24_4_ = auVar115._24_4_ * 0.0;
        auVar102._28_4_ = auVar115._28_4_;
        auVar22 = vfmsub231ps_fma(auVar102,ZEXT1632(auVar93),auVar113);
        auVar113 = vfmadd231ps_avx512vl(ZEXT1632(auVar22),auVar104,auVar110);
        auVar113 = vfmadd231ps_avx512vl(auVar113,auVar104,ZEXT1632(auVar21));
        auVar114 = ZEXT1632(auVar95);
        uVar85 = vcmpps_avx512vl(auVar113,auVar114,2);
        bVar76 = (byte)uVar85;
        fVar86 = (float)((uint)(bVar76 & 1) * auVar92._0_4_ |
                        (uint)!(bool)(bVar76 & 1) * auVar23._0_4_);
        bVar81 = (bool)((byte)(uVar85 >> 1) & 1);
        fVar133 = (float)((uint)bVar81 * auVar92._4_4_ | (uint)!bVar81 * auVar23._4_4_);
        bVar81 = (bool)((byte)(uVar85 >> 2) & 1);
        fVar135 = (float)((uint)bVar81 * auVar92._8_4_ | (uint)!bVar81 * auVar23._8_4_);
        bVar81 = (bool)((byte)(uVar85 >> 3) & 1);
        fVar138 = (float)((uint)bVar81 * auVar92._12_4_ | (uint)!bVar81 * auVar23._12_4_);
        auVar109 = ZEXT1632(CONCAT412(fVar138,CONCAT48(fVar135,CONCAT44(fVar133,fVar86))));
        fVar87 = (float)((uint)(bVar76 & 1) * auVar91._0_4_ |
                        (uint)!(bool)(bVar76 & 1) * auVar24._0_4_);
        bVar81 = (bool)((byte)(uVar85 >> 1) & 1);
        fVar134 = (float)((uint)bVar81 * auVar91._4_4_ | (uint)!bVar81 * auVar24._4_4_);
        bVar81 = (bool)((byte)(uVar85 >> 2) & 1);
        fVar136 = (float)((uint)bVar81 * auVar91._8_4_ | (uint)!bVar81 * auVar24._8_4_);
        bVar81 = (bool)((byte)(uVar85 >> 3) & 1);
        fVar139 = (float)((uint)bVar81 * auVar91._12_4_ | (uint)!bVar81 * auVar24._12_4_);
        auVar100 = ZEXT1632(CONCAT412(fVar139,CONCAT48(fVar136,CONCAT44(fVar134,fVar87))));
        auVar112._0_4_ =
             (float)((uint)(bVar76 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar29._0_4_)
        ;
        bVar81 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar112._4_4_ = (float)((uint)bVar81 * auVar98._4_4_ | (uint)!bVar81 * auVar29._4_4_);
        bVar81 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar112._8_4_ = (float)((uint)bVar81 * auVar98._8_4_ | (uint)!bVar81 * auVar29._8_4_);
        bVar81 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar112._12_4_ = (float)((uint)bVar81 * auVar98._12_4_ | (uint)!bVar81 * auVar29._12_4_);
        fVar171 = (float)((uint)((byte)(uVar85 >> 4) & 1) * auVar98._16_4_);
        auVar112._16_4_ = fVar171;
        fVar178 = (float)((uint)((byte)(uVar85 >> 5) & 1) * auVar98._20_4_);
        auVar112._20_4_ = fVar178;
        fVar179 = (float)((uint)((byte)(uVar85 >> 6) & 1) * auVar98._24_4_);
        auVar112._24_4_ = fVar179;
        iVar1 = (uint)(byte)(uVar85 >> 7) * auVar98._28_4_;
        auVar112._28_4_ = iVar1;
        auVar115 = vblendmps_avx512vl(ZEXT1632(auVar93),auVar99);
        auVar119._0_4_ =
             (uint)(bVar76 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar21._0_4_;
        bVar81 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar119._4_4_ = (uint)bVar81 * auVar115._4_4_ | (uint)!bVar81 * auVar21._4_4_;
        bVar81 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar119._8_4_ = (uint)bVar81 * auVar115._8_4_ | (uint)!bVar81 * auVar21._8_4_;
        bVar81 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar119._12_4_ = (uint)bVar81 * auVar115._12_4_ | (uint)!bVar81 * auVar21._12_4_;
        auVar119._16_4_ = (uint)((byte)(uVar85 >> 4) & 1) * auVar115._16_4_;
        auVar119._20_4_ = (uint)((byte)(uVar85 >> 5) & 1) * auVar115._20_4_;
        auVar119._24_4_ = (uint)((byte)(uVar85 >> 6) & 1) * auVar115._24_4_;
        auVar119._28_4_ = (uint)(byte)(uVar85 >> 7) * auVar115._28_4_;
        auVar115 = vblendmps_avx512vl(ZEXT1632(auVar94),ZEXT1632(auVar212));
        auVar120._0_4_ =
             (float)((uint)(bVar76 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar91._0_4_
                    );
        bVar81 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar120._4_4_ = (float)((uint)bVar81 * auVar115._4_4_ | (uint)!bVar81 * auVar91._4_4_);
        bVar81 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar120._8_4_ = (float)((uint)bVar81 * auVar115._8_4_ | (uint)!bVar81 * auVar91._8_4_);
        bVar81 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar120._12_4_ = (float)((uint)bVar81 * auVar115._12_4_ | (uint)!bVar81 * auVar91._12_4_);
        fVar180 = (float)((uint)((byte)(uVar85 >> 4) & 1) * auVar115._16_4_);
        auVar120._16_4_ = fVar180;
        fVar164 = (float)((uint)((byte)(uVar85 >> 5) & 1) * auVar115._20_4_);
        auVar120._20_4_ = fVar164;
        fVar170 = (float)((uint)((byte)(uVar85 >> 6) & 1) * auVar115._24_4_);
        auVar120._24_4_ = fVar170;
        auVar120._28_4_ = (uint)(byte)(uVar85 >> 7) * auVar115._28_4_;
        auVar115 = vblendmps_avx512vl(auVar111,ZEXT1632(auVar20));
        auVar121._0_4_ =
             (float)((uint)(bVar76 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar98._0_4_
                    );
        bVar81 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar121._4_4_ = (float)((uint)bVar81 * auVar115._4_4_ | (uint)!bVar81 * auVar98._4_4_);
        bVar81 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar121._8_4_ = (float)((uint)bVar81 * auVar115._8_4_ | (uint)!bVar81 * auVar98._8_4_);
        bVar81 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar121._12_4_ = (float)((uint)bVar81 * auVar115._12_4_ | (uint)!bVar81 * auVar98._12_4_);
        bVar81 = (bool)((byte)(uVar85 >> 4) & 1);
        auVar121._16_4_ = (float)((uint)bVar81 * auVar115._16_4_ | (uint)!bVar81 * auVar98._16_4_);
        bVar81 = (bool)((byte)(uVar85 >> 5) & 1);
        auVar121._20_4_ = (float)((uint)bVar81 * auVar115._20_4_ | (uint)!bVar81 * auVar98._20_4_);
        bVar81 = (bool)((byte)(uVar85 >> 6) & 1);
        auVar121._24_4_ = (float)((uint)bVar81 * auVar115._24_4_ | (uint)!bVar81 * auVar98._24_4_);
        bVar81 = SUB81(uVar85 >> 7,0);
        auVar121._28_4_ = (uint)bVar81 * auVar115._28_4_ | (uint)!bVar81 * auVar98._28_4_;
        auVar122._0_4_ =
             (uint)(bVar76 & 1) * (int)auVar93._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar99._0_4_;
        bVar81 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar122._4_4_ = (uint)bVar81 * (int)auVar93._4_4_ | (uint)!bVar81 * auVar99._4_4_;
        bVar81 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar122._8_4_ = (uint)bVar81 * (int)auVar93._8_4_ | (uint)!bVar81 * auVar99._8_4_;
        bVar81 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar122._12_4_ = (uint)bVar81 * (int)auVar93._12_4_ | (uint)!bVar81 * auVar99._12_4_;
        auVar122._16_4_ = (uint)!(bool)((byte)(uVar85 >> 4) & 1) * auVar99._16_4_;
        auVar122._20_4_ = (uint)!(bool)((byte)(uVar85 >> 5) & 1) * auVar99._20_4_;
        auVar122._24_4_ = (uint)!(bool)((byte)(uVar85 >> 6) & 1) * auVar99._24_4_;
        auVar122._28_4_ = (uint)!SUB81(uVar85 >> 7,0) * auVar99._28_4_;
        bVar81 = (bool)((byte)(uVar85 >> 1) & 1);
        bVar14 = (bool)((byte)(uVar85 >> 2) & 1);
        bVar15 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar123._0_4_ =
             (uint)(bVar76 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar20._0_4_;
        bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar123._4_4_ = (uint)bVar13 * auVar111._4_4_ | (uint)!bVar13 * auVar20._4_4_;
        bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar123._8_4_ = (uint)bVar13 * auVar111._8_4_ | (uint)!bVar13 * auVar20._8_4_;
        bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar123._12_4_ = (uint)bVar13 * auVar111._12_4_ | (uint)!bVar13 * auVar20._12_4_;
        auVar123._16_4_ = (uint)((byte)(uVar85 >> 4) & 1) * auVar111._16_4_;
        auVar123._20_4_ = (uint)((byte)(uVar85 >> 5) & 1) * auVar111._20_4_;
        auVar123._24_4_ = (uint)((byte)(uVar85 >> 6) & 1) * auVar111._24_4_;
        iVar2 = (uint)(byte)(uVar85 >> 7) * auVar111._28_4_;
        auVar123._28_4_ = iVar2;
        auVar101 = vsubps_avx512vl(auVar122,auVar109);
        auVar115 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar94._12_4_ |
                                                 (uint)!bVar15 * auVar212._12_4_,
                                                 CONCAT48((uint)bVar14 * (int)auVar94._8_4_ |
                                                          (uint)!bVar14 * auVar212._8_4_,
                                                          CONCAT44((uint)bVar81 * (int)auVar94._4_4_
                                                                   | (uint)!bVar81 * auVar212._4_4_,
                                                                   (uint)(bVar76 & 1) *
                                                                   (int)auVar94._0_4_ |
                                                                   (uint)!(bool)(bVar76 & 1) *
                                                                   auVar212._0_4_)))),auVar100);
        auVar111 = vsubps_avx(auVar123,auVar112);
        auVar110 = vsubps_avx(auVar109,auVar119);
        auVar98 = vsubps_avx(auVar100,auVar120);
        auVar99 = vsubps_avx(auVar112,auVar121);
        auVar104._4_4_ = auVar111._4_4_ * fVar133;
        auVar104._0_4_ = auVar111._0_4_ * fVar86;
        auVar104._8_4_ = auVar111._8_4_ * fVar135;
        auVar104._12_4_ = auVar111._12_4_ * fVar138;
        auVar104._16_4_ = auVar111._16_4_ * 0.0;
        auVar104._20_4_ = auVar111._20_4_ * 0.0;
        auVar104._24_4_ = auVar111._24_4_ * 0.0;
        auVar104._28_4_ = iVar2;
        auVar92 = vfmsub231ps_fma(auVar104,auVar112,auVar101);
        auVar105._4_4_ = fVar134 * auVar101._4_4_;
        auVar105._0_4_ = fVar87 * auVar101._0_4_;
        auVar105._8_4_ = fVar136 * auVar101._8_4_;
        auVar105._12_4_ = fVar139 * auVar101._12_4_;
        auVar105._16_4_ = auVar101._16_4_ * 0.0;
        auVar105._20_4_ = auVar101._20_4_ * 0.0;
        auVar105._24_4_ = auVar101._24_4_ * 0.0;
        auVar105._28_4_ = auVar113._28_4_;
        auVar91 = vfmsub231ps_fma(auVar105,auVar109,auVar115);
        auVar113 = vfmadd231ps_avx512vl(ZEXT1632(auVar91),auVar114,ZEXT1632(auVar92));
        auVar174._0_4_ = auVar115._0_4_ * auVar112._0_4_;
        auVar174._4_4_ = auVar115._4_4_ * auVar112._4_4_;
        auVar174._8_4_ = auVar115._8_4_ * auVar112._8_4_;
        auVar174._12_4_ = auVar115._12_4_ * auVar112._12_4_;
        auVar174._16_4_ = auVar115._16_4_ * fVar171;
        auVar174._20_4_ = auVar115._20_4_ * fVar178;
        auVar174._24_4_ = auVar115._24_4_ * fVar179;
        auVar174._28_4_ = 0;
        auVar92 = vfmsub231ps_fma(auVar174,auVar100,auVar111);
        auVar102 = vfmadd231ps_avx512vl(auVar113,auVar114,ZEXT1632(auVar92));
        auVar113 = vmulps_avx512vl(auVar99,auVar119);
        auVar113 = vfmsub231ps_avx512vl(auVar113,auVar110,auVar121);
        auVar108._4_4_ = auVar98._4_4_ * auVar121._4_4_;
        auVar108._0_4_ = auVar98._0_4_ * auVar121._0_4_;
        auVar108._8_4_ = auVar98._8_4_ * auVar121._8_4_;
        auVar108._12_4_ = auVar98._12_4_ * auVar121._12_4_;
        auVar108._16_4_ = auVar98._16_4_ * auVar121._16_4_;
        auVar108._20_4_ = auVar98._20_4_ * auVar121._20_4_;
        auVar108._24_4_ = auVar98._24_4_ * auVar121._24_4_;
        auVar108._28_4_ = auVar121._28_4_;
        auVar92 = vfmsub231ps_fma(auVar108,auVar120,auVar99);
        auVar175._0_4_ = auVar120._0_4_ * auVar110._0_4_;
        auVar175._4_4_ = auVar120._4_4_ * auVar110._4_4_;
        auVar175._8_4_ = auVar120._8_4_ * auVar110._8_4_;
        auVar175._12_4_ = auVar120._12_4_ * auVar110._12_4_;
        auVar175._16_4_ = fVar180 * auVar110._16_4_;
        auVar175._20_4_ = fVar164 * auVar110._20_4_;
        auVar175._24_4_ = fVar170 * auVar110._24_4_;
        auVar175._28_4_ = 0;
        auVar91 = vfmsub231ps_fma(auVar175,auVar98,auVar119);
        auVar113 = vfmadd231ps_avx512vl(ZEXT1632(auVar91),auVar114,auVar113);
        auVar104 = vfmadd231ps_avx512vl(auVar113,auVar114,ZEXT1632(auVar92));
        auVar113 = vmaxps_avx(auVar102,auVar104);
        uVar143 = vcmpps_avx512vl(auVar113,auVar114,2);
        local_250 = local_250 & (byte)uVar143;
        auVar209 = ZEXT3264(local_4a0);
        auVar210 = ZEXT3264(local_3e0);
        auVar211 = ZEXT3264(local_4c0);
        auVar214 = ZEXT3264(local_4e0);
        auVar215 = ZEXT3264(local_500);
        auVar216 = ZEXT3264(local_420);
        auVar204 = ZEXT1664(_local_670);
        if (local_250 == 0) {
          local_250 = 0;
        }
        else {
          auVar40._4_4_ = auVar99._4_4_ * auVar115._4_4_;
          auVar40._0_4_ = auVar99._0_4_ * auVar115._0_4_;
          auVar40._8_4_ = auVar99._8_4_ * auVar115._8_4_;
          auVar40._12_4_ = auVar99._12_4_ * auVar115._12_4_;
          auVar40._16_4_ = auVar99._16_4_ * auVar115._16_4_;
          auVar40._20_4_ = auVar99._20_4_ * auVar115._20_4_;
          auVar40._24_4_ = auVar99._24_4_ * auVar115._24_4_;
          auVar40._28_4_ = auVar113._28_4_;
          auVar212 = vfmsub231ps_fma(auVar40,auVar98,auVar111);
          auVar41._4_4_ = auVar111._4_4_ * auVar110._4_4_;
          auVar41._0_4_ = auVar111._0_4_ * auVar110._0_4_;
          auVar41._8_4_ = auVar111._8_4_ * auVar110._8_4_;
          auVar41._12_4_ = auVar111._12_4_ * auVar110._12_4_;
          auVar41._16_4_ = auVar111._16_4_ * auVar110._16_4_;
          auVar41._20_4_ = auVar111._20_4_ * auVar110._20_4_;
          auVar41._24_4_ = auVar111._24_4_ * auVar110._24_4_;
          auVar41._28_4_ = auVar111._28_4_;
          auVar91 = vfmsub231ps_fma(auVar41,auVar101,auVar99);
          auVar42._4_4_ = auVar98._4_4_ * auVar101._4_4_;
          auVar42._0_4_ = auVar98._0_4_ * auVar101._0_4_;
          auVar42._8_4_ = auVar98._8_4_ * auVar101._8_4_;
          auVar42._12_4_ = auVar98._12_4_ * auVar101._12_4_;
          auVar42._16_4_ = auVar98._16_4_ * auVar101._16_4_;
          auVar42._20_4_ = auVar98._20_4_ * auVar101._20_4_;
          auVar42._24_4_ = auVar98._24_4_ * auVar101._24_4_;
          auVar42._28_4_ = auVar98._28_4_;
          auVar20 = vfmsub231ps_fma(auVar42,auVar110,auVar115);
          auVar92 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar91),ZEXT1632(auVar20));
          auVar113 = vfmadd231ps_avx512vl(ZEXT1632(auVar92),ZEXT1632(auVar212),auVar114);
          auVar115 = vrcp14ps_avx512vl(auVar113);
          auVar33._8_4_ = 0x3f800000;
          auVar33._0_8_ = &DAT_3f8000003f800000;
          auVar33._12_4_ = 0x3f800000;
          auVar33._16_4_ = 0x3f800000;
          auVar33._20_4_ = 0x3f800000;
          auVar33._24_4_ = 0x3f800000;
          auVar33._28_4_ = 0x3f800000;
          auVar111 = vfnmadd213ps_avx512vl(auVar115,auVar113,auVar33);
          auVar92 = vfmadd132ps_fma(auVar111,auVar115,auVar115);
          auVar43._4_4_ = auVar20._4_4_ * auVar112._4_4_;
          auVar43._0_4_ = auVar20._0_4_ * auVar112._0_4_;
          auVar43._8_4_ = auVar20._8_4_ * auVar112._8_4_;
          auVar43._12_4_ = auVar20._12_4_ * auVar112._12_4_;
          auVar43._16_4_ = fVar171 * 0.0;
          auVar43._20_4_ = fVar178 * 0.0;
          auVar43._24_4_ = fVar179 * 0.0;
          auVar43._28_4_ = iVar1;
          auVar91 = vfmadd231ps_fma(auVar43,auVar100,ZEXT1632(auVar91));
          auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar109,ZEXT1632(auVar212));
          fVar171 = auVar92._0_4_;
          fVar178 = auVar92._4_4_;
          fVar179 = auVar92._8_4_;
          fVar180 = auVar92._12_4_;
          auVar115 = ZEXT1632(CONCAT412(auVar91._12_4_ * fVar180,
                                        CONCAT48(auVar91._8_4_ * fVar179,
                                                 CONCAT44(auVar91._4_4_ * fVar178,
                                                          auVar91._0_4_ * fVar171))));
          auVar192._4_4_ = uVar142;
          auVar192._0_4_ = uVar142;
          auVar192._8_4_ = uVar142;
          auVar192._12_4_ = uVar142;
          auVar192._16_4_ = uVar142;
          auVar192._20_4_ = uVar142;
          auVar192._24_4_ = uVar142;
          auVar192._28_4_ = uVar142;
          uVar143 = vcmpps_avx512vl(auVar192,auVar115,2);
          uVar4 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar34._4_4_ = uVar4;
          auVar34._0_4_ = uVar4;
          auVar34._8_4_ = uVar4;
          auVar34._12_4_ = uVar4;
          auVar34._16_4_ = uVar4;
          auVar34._20_4_ = uVar4;
          auVar34._24_4_ = uVar4;
          auVar34._28_4_ = uVar4;
          uVar26 = vcmpps_avx512vl(auVar115,auVar34,2);
          local_250 = (byte)uVar143 & (byte)uVar26 & local_250;
          if (local_250 != 0) {
            uVar143 = vcmpps_avx512vl(auVar113,auVar114,4);
            if ((local_250 & (byte)uVar143) != 0) {
              local_250 = local_250 & (byte)uVar143;
              fVar164 = auVar102._0_4_ * fVar171;
              fVar170 = auVar102._4_4_ * fVar178;
              auVar44._4_4_ = fVar170;
              auVar44._0_4_ = fVar164;
              fVar86 = auVar102._8_4_ * fVar179;
              auVar44._8_4_ = fVar86;
              fVar87 = auVar102._12_4_ * fVar180;
              auVar44._12_4_ = fVar87;
              fVar133 = auVar102._16_4_ * 0.0;
              auVar44._16_4_ = fVar133;
              fVar134 = auVar102._20_4_ * 0.0;
              auVar44._20_4_ = fVar134;
              fVar135 = auVar102._24_4_ * 0.0;
              auVar44._24_4_ = fVar135;
              auVar44._28_4_ = auVar102._28_4_;
              fVar171 = auVar104._0_4_ * fVar171;
              fVar178 = auVar104._4_4_ * fVar178;
              auVar45._4_4_ = fVar178;
              auVar45._0_4_ = fVar171;
              fVar179 = auVar104._8_4_ * fVar179;
              auVar45._8_4_ = fVar179;
              fVar180 = auVar104._12_4_ * fVar180;
              auVar45._12_4_ = fVar180;
              fVar136 = auVar104._16_4_ * 0.0;
              auVar45._16_4_ = fVar136;
              fVar138 = auVar104._20_4_ * 0.0;
              auVar45._20_4_ = fVar138;
              fVar139 = auVar104._24_4_ * 0.0;
              auVar45._24_4_ = fVar139;
              auVar45._28_4_ = auVar104._28_4_;
              auVar186._8_4_ = 0x3f800000;
              auVar186._0_8_ = &DAT_3f8000003f800000;
              auVar186._12_4_ = 0x3f800000;
              auVar186._16_4_ = 0x3f800000;
              auVar186._20_4_ = 0x3f800000;
              auVar186._24_4_ = 0x3f800000;
              auVar186._28_4_ = 0x3f800000;
              auVar113 = vsubps_avx(auVar186,auVar44);
              local_5e0._0_4_ =
                   (uint)(bVar76 & 1) * (int)fVar164 | (uint)!(bool)(bVar76 & 1) * auVar113._0_4_;
              bVar81 = (bool)((byte)(uVar85 >> 1) & 1);
              local_5e0._4_4_ = (uint)bVar81 * (int)fVar170 | (uint)!bVar81 * auVar113._4_4_;
              bVar81 = (bool)((byte)(uVar85 >> 2) & 1);
              local_5e0._8_4_ = (uint)bVar81 * (int)fVar86 | (uint)!bVar81 * auVar113._8_4_;
              bVar81 = (bool)((byte)(uVar85 >> 3) & 1);
              local_5e0._12_4_ = (uint)bVar81 * (int)fVar87 | (uint)!bVar81 * auVar113._12_4_;
              bVar81 = (bool)((byte)(uVar85 >> 4) & 1);
              local_5e0._16_4_ = (uint)bVar81 * (int)fVar133 | (uint)!bVar81 * auVar113._16_4_;
              bVar81 = (bool)((byte)(uVar85 >> 5) & 1);
              local_5e0._20_4_ = (uint)bVar81 * (int)fVar134 | (uint)!bVar81 * auVar113._20_4_;
              bVar81 = (bool)((byte)(uVar85 >> 6) & 1);
              local_5e0._24_4_ = (uint)bVar81 * (int)fVar135 | (uint)!bVar81 * auVar113._24_4_;
              bVar81 = SUB81(uVar85 >> 7,0);
              local_5e0._28_4_ = (uint)bVar81 * auVar102._28_4_ | (uint)!bVar81 * auVar113._28_4_;
              auVar113 = vsubps_avx(auVar186,auVar45);
              bVar81 = (bool)((byte)(uVar85 >> 1) & 1);
              bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
              bVar14 = (bool)((byte)(uVar85 >> 3) & 1);
              bVar15 = (bool)((byte)(uVar85 >> 4) & 1);
              bVar16 = (bool)((byte)(uVar85 >> 5) & 1);
              bVar17 = (bool)((byte)(uVar85 >> 6) & 1);
              bVar18 = SUB81(uVar85 >> 7,0);
              local_1a0._4_4_ = (uint)bVar81 * (int)fVar178 | (uint)!bVar81 * auVar113._4_4_;
              local_1a0._0_4_ =
                   (uint)(bVar76 & 1) * (int)fVar171 | (uint)!(bool)(bVar76 & 1) * auVar113._0_4_;
              local_1a0._8_4_ = (uint)bVar13 * (int)fVar179 | (uint)!bVar13 * auVar113._8_4_;
              local_1a0._12_4_ = (uint)bVar14 * (int)fVar180 | (uint)!bVar14 * auVar113._12_4_;
              local_1a0._16_4_ = (uint)bVar15 * (int)fVar136 | (uint)!bVar15 * auVar113._16_4_;
              local_1a0._20_4_ = (uint)bVar16 * (int)fVar138 | (uint)!bVar16 * auVar113._20_4_;
              local_1a0._24_4_ = (uint)bVar17 * (int)fVar139 | (uint)!bVar17 * auVar113._24_4_;
              local_1a0._28_4_ = (uint)bVar18 * auVar104._28_4_ | (uint)!bVar18 * auVar113._28_4_;
              local_600 = auVar115;
              goto LAB_01c840b0;
            }
          }
          local_250 = 0;
        }
LAB_01c840b0:
        auVar208 = ZEXT3264(auVar103);
        if (local_250 != 0) {
          auVar113 = vsubps_avx(ZEXT1632(auVar25),auVar106);
          auVar92 = vfmadd213ps_fma(auVar113,local_5e0,auVar106);
          uVar4 = *(undefined4 *)((long)local_6a8->ray_space + k * 4 + -0x10);
          auVar106._4_4_ = uVar4;
          auVar106._0_4_ = uVar4;
          auVar106._8_4_ = uVar4;
          auVar106._12_4_ = uVar4;
          auVar106._16_4_ = uVar4;
          auVar106._20_4_ = uVar4;
          auVar106._24_4_ = uVar4;
          auVar106._28_4_ = uVar4;
          auVar113 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar92._12_4_ + auVar92._12_4_,
                                                        CONCAT48(auVar92._8_4_ + auVar92._8_4_,
                                                                 CONCAT44(auVar92._4_4_ +
                                                                          auVar92._4_4_,
                                                                          auVar92._0_4_ +
                                                                          auVar92._0_4_)))),auVar106
                                    );
          uVar143 = vcmpps_avx512vl(local_600,auVar113,6);
          local_250 = local_250 & (byte)uVar143;
          if (local_250 != 0) {
            auVar152._8_4_ = 0xbf800000;
            auVar152._0_8_ = 0xbf800000bf800000;
            auVar152._12_4_ = 0xbf800000;
            auVar152._16_4_ = 0xbf800000;
            auVar152._20_4_ = 0xbf800000;
            auVar152._24_4_ = 0xbf800000;
            auVar152._28_4_ = 0xbf800000;
            auVar35._8_4_ = 0x40000000;
            auVar35._0_8_ = 0x4000000040000000;
            auVar35._12_4_ = 0x40000000;
            auVar35._16_4_ = 0x40000000;
            auVar35._20_4_ = 0x40000000;
            auVar35._24_4_ = 0x40000000;
            auVar35._28_4_ = 0x40000000;
            local_2e0 = vfmadd132ps_avx512vl(local_1a0,auVar152,auVar35);
            local_1a0 = local_2e0;
            auVar113 = local_1a0;
            local_2a0 = 0;
            local_290 = local_610._0_8_;
            uStack_288 = local_610._8_8_;
            local_280 = local_460._0_8_;
            uStack_278 = local_460._8_8_;
            local_270 = local_470._0_8_;
            uStack_268 = local_470._8_8_;
            local_260 = local_450._0_8_;
            uStack_258 = local_450._8_8_;
            if ((pGVar80->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar81 = true, pGVar80->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar171 = 1.0 / auVar107._0_4_;
                local_240[0] = fVar171 * (local_5e0._0_4_ + 0.0);
                local_240[1] = fVar171 * (local_5e0._4_4_ + 1.0);
                local_240[2] = fVar171 * (local_5e0._8_4_ + 2.0);
                local_240[3] = fVar171 * (local_5e0._12_4_ + 3.0);
                fStack_230 = fVar171 * (local_5e0._16_4_ + 4.0);
                fStack_22c = fVar171 * (local_5e0._20_4_ + 5.0);
                fStack_228 = fVar171 * (local_5e0._24_4_ + 6.0);
                fStack_224 = local_5e0._28_4_ + 7.0;
                local_1a0._0_8_ = local_2e0._0_8_;
                local_1a0._8_8_ = local_2e0._8_8_;
                local_1a0._16_8_ = local_2e0._16_8_;
                local_1a0._24_8_ = local_2e0._24_8_;
                local_220 = local_1a0._0_8_;
                uStack_218 = local_1a0._8_8_;
                uStack_210 = local_1a0._16_8_;
                uStack_208 = local_1a0._24_8_;
                local_200 = local_600;
                lVar83 = 0;
                local_3c0 = (ulong)local_250;
                for (uVar85 = local_3c0; (uVar85 & 1) == 0;
                    uVar85 = uVar85 >> 1 | 0x8000000000000000) {
                  lVar83 = lVar83 + 1;
                }
                local_640 = vpbroadcastd_avx512vl();
                local_650 = local_460._0_4_;
                uStack_64c = local_460._4_4_;
                uStack_648 = local_460._8_8_;
                local_660 = vpbroadcastd_avx512vl();
                local_5a0 = local_470._0_8_;
                uStack_598 = local_470._8_8_;
                local_5b0 = local_450._0_4_;
                fStack_5ac = local_450._4_4_;
                fStack_5a8 = local_450._8_4_;
                fStack_5a4 = local_450._12_4_;
                bVar81 = true;
                local_540 = uVar142;
                local_520 = auVar103;
                local_300 = local_5e0;
                local_2c0 = local_600;
                local_29c = iVar8;
                local_1a0 = auVar113;
                do {
                  auVar212 = auVar213._0_16_;
                  uVar4 = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_360 = local_240[lVar83];
                  local_1e0 = (uint)lVar83;
                  uStack_1dc = (undefined4)((ulong)lVar83 >> 0x20);
                  local_350 = *(undefined4 *)((long)&local_220 + lVar83 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_200 + lVar83 * 4);
                  local_6a0.context = context->user;
                  fVar178 = 1.0 - local_360;
                  fVar171 = fVar178 * fVar178 * -3.0;
                  auVar92 = vfmadd231ss_fma(ZEXT416((uint)(fVar178 * fVar178)),
                                            ZEXT416((uint)(local_360 * fVar178)),ZEXT416(0xc0000000)
                                           );
                  auVar91 = vfmsub132ss_fma(ZEXT416((uint)(local_360 * fVar178)),
                                            ZEXT416((uint)(local_360 * local_360)),
                                            ZEXT416(0x40000000));
                  fVar178 = auVar92._0_4_ * 3.0;
                  fVar179 = auVar91._0_4_ * 3.0;
                  fVar180 = local_360 * local_360 * 3.0;
                  auVar184._0_4_ = fVar180 * local_5b0;
                  auVar184._4_4_ = fVar180 * fStack_5ac;
                  auVar184._8_4_ = fVar180 * fStack_5a8;
                  auVar184._12_4_ = fVar180 * fStack_5a4;
                  auVar148._4_4_ = fVar179;
                  auVar148._0_4_ = fVar179;
                  auVar148._8_4_ = fVar179;
                  auVar148._12_4_ = fVar179;
                  auVar71._8_8_ = uStack_598;
                  auVar71._0_8_ = local_5a0;
                  auVar92 = vfmadd132ps_fma(auVar148,auVar184,auVar71);
                  auVar167._4_4_ = fVar178;
                  auVar167._0_4_ = fVar178;
                  auVar167._8_4_ = fVar178;
                  auVar167._12_4_ = fVar178;
                  auVar69._4_4_ = uStack_64c;
                  auVar69._0_4_ = local_650;
                  auVar69._8_8_ = uStack_648;
                  auVar92 = vfmadd132ps_fma(auVar167,auVar92,auVar69);
                  auVar149._4_4_ = fVar171;
                  auVar149._0_4_ = fVar171;
                  auVar149._8_4_ = fVar171;
                  auVar149._12_4_ = fVar171;
                  auVar92 = vfmadd132ps_fma(auVar149,auVar92,local_610);
                  local_390 = auVar92._0_4_;
                  local_380 = vshufps_avx(auVar92,auVar92,0x55);
                  local_370 = vshufps_avx(auVar92,auVar92,0xaa);
                  local_340 = local_660._0_8_;
                  uStack_338 = local_660._8_8_;
                  local_330 = local_640;
                  vpcmpeqd_avx2(ZEXT1632(local_640),ZEXT1632(local_640));
                  uStack_31c = (local_6a0.context)->instID[0];
                  local_320 = uStack_31c;
                  uStack_318 = uStack_31c;
                  uStack_314 = uStack_31c;
                  uStack_310 = (local_6a0.context)->instPrimID[0];
                  uStack_30c = uStack_310;
                  uStack_308 = uStack_310;
                  uStack_304 = uStack_310;
                  local_6d0 = local_480._0_8_;
                  uStack_6c8 = local_480._8_8_;
                  local_6a0.valid = (int *)&local_6d0;
                  local_6a0.geometryUserPtr = pGVar80->userPtr;
                  local_6a0.hit = (RTCHitN *)&local_390;
                  local_6a0.N = 4;
                  local_6a0.ray = (RTCRayN *)ray;
                  uStack_38c = local_390;
                  uStack_388 = local_390;
                  uStack_384 = local_390;
                  fStack_35c = local_360;
                  fStack_358 = local_360;
                  fStack_354 = local_360;
                  uStack_34c = local_350;
                  uStack_348 = local_350;
                  uStack_344 = local_350;
                  if (pGVar80->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar80->occlusionFilterN)(&local_6a0);
                    auVar204 = ZEXT1664(_local_670);
                    auVar208 = ZEXT3264(local_520);
                    auVar217 = ZEXT3264(local_440);
                    auVar216 = ZEXT3264(local_420);
                    auVar215 = ZEXT3264(local_500);
                    auVar214 = ZEXT3264(local_4e0);
                    auVar218 = ZEXT3264(local_400);
                    auVar211 = ZEXT3264(local_4c0);
                    auVar210 = ZEXT3264(local_3e0);
                    auVar209 = ZEXT3264(local_4a0);
                    auVar92 = vxorps_avx512vl(auVar212,auVar212);
                    auVar213 = ZEXT1664(auVar92);
                    uVar142 = local_540;
                  }
                  auVar92 = auVar213._0_16_;
                  auVar65._8_8_ = uStack_6c8;
                  auVar65._0_8_ = local_6d0;
                  uVar85 = vptestmd_avx512vl(auVar65,auVar65);
                  if ((uVar85 & 0xf) != 0) {
                    p_Var12 = context->args->filter;
                    if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar80->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var12)(&local_6a0);
                      auVar204 = ZEXT1664(_local_670);
                      auVar208 = ZEXT3264(local_520);
                      auVar217 = ZEXT3264(local_440);
                      auVar216 = ZEXT3264(local_420);
                      auVar215 = ZEXT3264(local_500);
                      auVar214 = ZEXT3264(local_4e0);
                      auVar218 = ZEXT3264(local_400);
                      auVar211 = ZEXT3264(local_4c0);
                      auVar210 = ZEXT3264(local_3e0);
                      auVar209 = ZEXT3264(local_4a0);
                      auVar92 = vxorps_avx512vl(auVar92,auVar92);
                      auVar213 = ZEXT1664(auVar92);
                      uVar142 = local_540;
                    }
                    auVar103 = auVar208._0_32_;
                    auVar66._8_8_ = uStack_6c8;
                    auVar66._0_8_ = local_6d0;
                    auVar92 = *(undefined1 (*) [16])(local_6a0.ray + 0x80);
                    uVar85 = vptestmd_avx512vl(auVar66,auVar66);
                    uVar85 = uVar85 & 0xf;
                    auVar91 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar13 = (bool)((byte)uVar85 & 1);
                    auVar96._0_4_ = (uint)bVar13 * auVar91._0_4_ | (uint)!bVar13 * auVar92._0_4_;
                    bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
                    auVar96._4_4_ = (uint)bVar13 * auVar91._4_4_ | (uint)!bVar13 * auVar92._4_4_;
                    bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
                    auVar96._8_4_ = (uint)bVar13 * auVar91._8_4_ | (uint)!bVar13 * auVar92._8_4_;
                    bVar13 = SUB81(uVar85 >> 3,0);
                    auVar96._12_4_ = (uint)bVar13 * auVar91._12_4_ | (uint)!bVar13 * auVar92._12_4_;
                    *(undefined1 (*) [16])(local_6a0.ray + 0x80) = auVar96;
                    uVar202 = auVar204._0_4_;
                    if ((byte)uVar85 != 0) break;
                  }
                  auVar103 = auVar208._0_32_;
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar4;
                  lVar83 = 0;
                  local_3c0 = local_3c0 ^ 1L << ((ulong)local_1e0 & 0x3f);
                  for (uVar85 = local_3c0; (uVar85 & 1) == 0;
                      uVar85 = uVar85 >> 1 | 0x8000000000000000) {
                    lVar83 = lVar83 + 1;
                  }
                  bVar81 = local_3c0 != 0;
                  uVar202 = auVar204._0_4_;
                } while (bVar81);
              }
              goto LAB_01c846ad;
            }
          }
        }
        bVar81 = false;
      }
LAB_01c846ad:
      local_540 = uVar202;
      if (8 < iVar8) {
        auVar113 = vpbroadcastd_avx512vl();
        auVar204 = ZEXT3264(auVar113);
        local_1e0 = uVar142;
        uStack_1dc = uVar142;
        uStack_1d8 = uVar142;
        uStack_1d4 = uVar142;
        uStack_1d0 = uVar142;
        uStack_1cc = uVar142;
        uStack_1c8 = uVar142;
        uStack_1c4 = uVar142;
        fStack_3b8 = 1.0 / (float)local_630._0_4_;
        local_630 = vpbroadcastd_avx512vl();
        local_620 = vpbroadcastd_avx512vl();
        lVar83 = 8;
        uStack_53c = local_540;
        uStack_538 = local_540;
        uStack_534 = local_540;
        uStack_530 = local_540;
        uStack_52c = local_540;
        uStack_528 = local_540;
        uStack_524 = local_540;
        local_520 = auVar103;
        fStack_3b4 = fStack_3b8;
        fStack_3b0 = fStack_3b8;
        fStack_3ac = fStack_3b8;
        fStack_3a8 = fStack_3b8;
        fStack_3a4 = fStack_3b8;
        local_3c0._0_4_ = fStack_3b8;
        local_3c0._4_4_ = fStack_3b8;
        do {
          auVar113 = vpbroadcastd_avx512vl();
          auVar98 = vpor_avx2(auVar113,_DAT_0205a920);
          uVar26 = vpcmpgtd_avx512vl(auVar204._0_32_,auVar98);
          auVar113 = *(undefined1 (*) [32])(bezier_basis0 + lVar83 * 4 + lVar27);
          auVar115 = *(undefined1 (*) [32])(lVar27 + 0x2227768 + lVar83 * 4);
          auVar111 = *(undefined1 (*) [32])(lVar27 + 0x2227bec + lVar83 * 4);
          auVar110 = *(undefined1 (*) [32])(lVar27 + 0x2228070 + lVar83 * 4);
          local_420 = auVar216._0_32_;
          auVar99 = vmulps_avx512vl(local_420,auVar110);
          local_440 = auVar217._0_32_;
          auVar109 = vmulps_avx512vl(local_440,auVar110);
          auVar46._4_4_ = auVar110._4_4_ * (float)local_e0._4_4_;
          auVar46._0_4_ = auVar110._0_4_ * (float)local_e0._0_4_;
          auVar46._8_4_ = auVar110._8_4_ * fStack_d8;
          auVar46._12_4_ = auVar110._12_4_ * fStack_d4;
          auVar46._16_4_ = auVar110._16_4_ * fStack_d0;
          auVar46._20_4_ = auVar110._20_4_ * fStack_cc;
          auVar46._24_4_ = auVar110._24_4_ * fStack_c8;
          auVar46._28_4_ = auVar98._28_4_;
          auVar117 = auVar214._0_32_;
          auVar98 = vfmadd231ps_avx512vl(auVar99,auVar111,auVar117);
          auVar118 = auVar215._0_32_;
          auVar99 = vfmadd231ps_avx512vl(auVar109,auVar111,auVar118);
          auVar109 = vfmadd231ps_avx512vl(auVar46,auVar111,local_c0);
          auVar116 = auVar211._0_32_;
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar115,auVar116);
          local_400 = auVar218._0_32_;
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar115,local_400);
          auVar92 = vfmadd231ps_fma(auVar109,auVar115,local_a0);
          auVar114 = auVar209._0_32_;
          auVar102 = vfmadd231ps_avx512vl(auVar98,auVar113,auVar114);
          local_3e0 = auVar210._0_32_;
          auVar104 = vfmadd231ps_avx512vl(auVar99,auVar113,local_3e0);
          auVar98 = *(undefined1 (*) [32])(bezier_basis1 + lVar83 * 4 + lVar27);
          auVar99 = *(undefined1 (*) [32])(lVar27 + 0x2229b88 + lVar83 * 4);
          auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar113,local_80);
          auVar109 = *(undefined1 (*) [32])(lVar27 + 0x222a00c + lVar83 * 4);
          auVar100 = *(undefined1 (*) [32])(lVar27 + 0x222a490 + lVar83 * 4);
          auVar103 = vmulps_avx512vl(local_420,auVar100);
          auVar101 = vmulps_avx512vl(local_440,auVar100);
          auVar47._4_4_ = auVar100._4_4_ * (float)local_e0._4_4_;
          auVar47._0_4_ = auVar100._0_4_ * (float)local_e0._0_4_;
          auVar47._8_4_ = auVar100._8_4_ * fStack_d8;
          auVar47._12_4_ = auVar100._12_4_ * fStack_d4;
          auVar47._16_4_ = auVar100._16_4_ * fStack_d0;
          auVar47._20_4_ = auVar100._20_4_ * fStack_cc;
          auVar47._24_4_ = auVar100._24_4_ * fStack_c8;
          auVar47._28_4_ = uStack_c4;
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar109,auVar117);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar109,auVar118);
          auVar105 = vfmadd231ps_avx512vl(auVar47,auVar109,local_c0);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar99,auVar116);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar99,local_400);
          auVar91 = vfmadd231ps_fma(auVar105,auVar99,local_a0);
          auVar105 = vfmadd231ps_avx512vl(auVar103,auVar98,auVar114);
          auVar106 = vfmadd231ps_avx512vl(auVar101,auVar98,local_3e0);
          auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar98,local_80);
          auVar107 = vmaxps_avx512vl(ZEXT1632(auVar92),ZEXT1632(auVar91));
          auVar103 = vsubps_avx(auVar105,auVar102);
          auVar101 = vsubps_avx(auVar106,auVar104);
          auVar108 = vmulps_avx512vl(auVar104,auVar103);
          auVar112 = vmulps_avx512vl(auVar102,auVar101);
          auVar108 = vsubps_avx512vl(auVar108,auVar112);
          auVar112 = vmulps_avx512vl(auVar101,auVar101);
          auVar112 = vfmadd231ps_avx512vl(auVar112,auVar103,auVar103);
          auVar107 = vmulps_avx512vl(auVar107,auVar107);
          auVar107 = vmulps_avx512vl(auVar107,auVar112);
          auVar108 = vmulps_avx512vl(auVar108,auVar108);
          uVar143 = vcmpps_avx512vl(auVar108,auVar107,2);
          local_250 = (byte)uVar26 & (byte)uVar143;
          if (local_250 != 0) {
            auVar100 = vmulps_avx512vl(local_520,auVar100);
            auVar109 = vfmadd213ps_avx512vl(auVar109,local_140,auVar100);
            auVar99 = vfmadd213ps_avx512vl(auVar99,local_120,auVar109);
            auVar98 = vfmadd213ps_avx512vl(auVar98,local_100,auVar99);
            auVar110 = vmulps_avx512vl(local_520,auVar110);
            auVar111 = vfmadd213ps_avx512vl(auVar111,local_140,auVar110);
            auVar115 = vfmadd213ps_avx512vl(auVar115,local_120,auVar111);
            auVar99 = vfmadd213ps_avx512vl(auVar113,local_100,auVar115);
            auVar113 = *(undefined1 (*) [32])(lVar27 + 0x22284f4 + lVar83 * 4);
            auVar115 = *(undefined1 (*) [32])(lVar27 + 0x2228978 + lVar83 * 4);
            auVar111 = *(undefined1 (*) [32])(lVar27 + 0x2228dfc + lVar83 * 4);
            auVar110 = *(undefined1 (*) [32])(lVar27 + 0x2229280 + lVar83 * 4);
            auVar109 = vmulps_avx512vl(local_420,auVar110);
            auVar100 = vmulps_avx512vl(local_440,auVar110);
            auVar110 = vmulps_avx512vl(local_520,auVar110);
            auVar109 = vfmadd231ps_avx512vl(auVar109,auVar111,auVar117);
            auVar100 = vfmadd231ps_avx512vl(auVar100,auVar111,auVar118);
            auVar111 = vfmadd231ps_avx512vl(auVar110,local_140,auVar111);
            auVar110 = vfmadd231ps_avx512vl(auVar109,auVar115,auVar116);
            auVar109 = vfmadd231ps_avx512vl(auVar100,auVar115,local_400);
            auVar115 = vfmadd231ps_avx512vl(auVar111,local_120,auVar115);
            auVar110 = vfmadd231ps_avx512vl(auVar110,auVar113,auVar114);
            auVar109 = vfmadd231ps_avx512vl(auVar109,auVar113,local_3e0);
            auVar100 = vfmadd231ps_avx512vl(auVar115,local_100,auVar113);
            auVar113 = *(undefined1 (*) [32])(lVar27 + 0x222a914 + lVar83 * 4);
            auVar115 = *(undefined1 (*) [32])(lVar27 + 0x222b21c + lVar83 * 4);
            auVar111 = *(undefined1 (*) [32])(lVar27 + 0x222b6a0 + lVar83 * 4);
            auVar107 = vmulps_avx512vl(local_420,auVar111);
            auVar108 = vmulps_avx512vl(local_440,auVar111);
            auVar111 = vmulps_avx512vl(local_520,auVar111);
            auVar107 = vfmadd231ps_avx512vl(auVar107,auVar115,auVar117);
            auVar108 = vfmadd231ps_avx512vl(auVar108,auVar115,auVar118);
            auVar111 = vfmadd231ps_avx512vl(auVar111,local_140,auVar115);
            auVar115 = *(undefined1 (*) [32])(lVar27 + 0x222ad98 + lVar83 * 4);
            auVar107 = vfmadd231ps_avx512vl(auVar107,auVar115,auVar116);
            auVar108 = vfmadd231ps_avx512vl(auVar108,auVar115,local_400);
            auVar115 = vfmadd231ps_avx512vl(auVar111,local_120,auVar115);
            auVar111 = vfmadd231ps_avx512vl(auVar107,auVar113,auVar114);
            auVar107 = vfmadd231ps_avx512vl(auVar108,auVar113,local_3e0);
            auVar115 = vfmadd231ps_avx512vl(auVar115,local_100,auVar113);
            auVar108 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar110,auVar108);
            vandps_avx512vl(auVar109,auVar108);
            auVar113 = vmaxps_avx(auVar108,auVar108);
            vandps_avx512vl(auVar100,auVar108);
            auVar113 = vmaxps_avx(auVar113,auVar108);
            auVar73._4_4_ = uStack_53c;
            auVar73._0_4_ = local_540;
            auVar73._8_4_ = uStack_538;
            auVar73._12_4_ = uStack_534;
            auVar73._16_4_ = uStack_530;
            auVar73._20_4_ = uStack_52c;
            auVar73._24_4_ = uStack_528;
            auVar73._28_4_ = uStack_524;
            uVar85 = vcmpps_avx512vl(auVar113,auVar73,1);
            bVar13 = (bool)((byte)uVar85 & 1);
            auVar124._0_4_ = (float)((uint)bVar13 * auVar103._0_4_ | (uint)!bVar13 * auVar110._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
            auVar124._4_4_ = (float)((uint)bVar13 * auVar103._4_4_ | (uint)!bVar13 * auVar110._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
            auVar124._8_4_ = (float)((uint)bVar13 * auVar103._8_4_ | (uint)!bVar13 * auVar110._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
            auVar124._12_4_ =
                 (float)((uint)bVar13 * auVar103._12_4_ | (uint)!bVar13 * auVar110._12_4_);
            bVar13 = (bool)((byte)(uVar85 >> 4) & 1);
            auVar124._16_4_ =
                 (float)((uint)bVar13 * auVar103._16_4_ | (uint)!bVar13 * auVar110._16_4_);
            bVar13 = (bool)((byte)(uVar85 >> 5) & 1);
            auVar124._20_4_ =
                 (float)((uint)bVar13 * auVar103._20_4_ | (uint)!bVar13 * auVar110._20_4_);
            bVar13 = (bool)((byte)(uVar85 >> 6) & 1);
            auVar124._24_4_ =
                 (float)((uint)bVar13 * auVar103._24_4_ | (uint)!bVar13 * auVar110._24_4_);
            bVar13 = SUB81(uVar85 >> 7,0);
            auVar124._28_4_ = (uint)bVar13 * auVar103._28_4_ | (uint)!bVar13 * auVar110._28_4_;
            bVar13 = (bool)((byte)uVar85 & 1);
            auVar125._0_4_ = (float)((uint)bVar13 * auVar101._0_4_ | (uint)!bVar13 * auVar109._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
            auVar125._4_4_ = (float)((uint)bVar13 * auVar101._4_4_ | (uint)!bVar13 * auVar109._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
            auVar125._8_4_ = (float)((uint)bVar13 * auVar101._8_4_ | (uint)!bVar13 * auVar109._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
            auVar125._12_4_ =
                 (float)((uint)bVar13 * auVar101._12_4_ | (uint)!bVar13 * auVar109._12_4_);
            bVar13 = (bool)((byte)(uVar85 >> 4) & 1);
            auVar125._16_4_ =
                 (float)((uint)bVar13 * auVar101._16_4_ | (uint)!bVar13 * auVar109._16_4_);
            bVar13 = (bool)((byte)(uVar85 >> 5) & 1);
            auVar125._20_4_ =
                 (float)((uint)bVar13 * auVar101._20_4_ | (uint)!bVar13 * auVar109._20_4_);
            bVar13 = (bool)((byte)(uVar85 >> 6) & 1);
            auVar125._24_4_ =
                 (float)((uint)bVar13 * auVar101._24_4_ | (uint)!bVar13 * auVar109._24_4_);
            bVar13 = SUB81(uVar85 >> 7,0);
            auVar125._28_4_ = (uint)bVar13 * auVar101._28_4_ | (uint)!bVar13 * auVar109._28_4_;
            vandps_avx512vl(auVar111,auVar108);
            vandps_avx512vl(auVar107,auVar108);
            auVar113 = vmaxps_avx(auVar125,auVar125);
            vandps_avx512vl(auVar115,auVar108);
            auVar113 = vmaxps_avx(auVar113,auVar125);
            uVar85 = vcmpps_avx512vl(auVar113,auVar73,1);
            bVar13 = (bool)((byte)uVar85 & 1);
            auVar126._0_4_ = (uint)bVar13 * auVar103._0_4_ | (uint)!bVar13 * auVar111._0_4_;
            bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
            auVar126._4_4_ = (uint)bVar13 * auVar103._4_4_ | (uint)!bVar13 * auVar111._4_4_;
            bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
            auVar126._8_4_ = (uint)bVar13 * auVar103._8_4_ | (uint)!bVar13 * auVar111._8_4_;
            bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
            auVar126._12_4_ = (uint)bVar13 * auVar103._12_4_ | (uint)!bVar13 * auVar111._12_4_;
            bVar13 = (bool)((byte)(uVar85 >> 4) & 1);
            auVar126._16_4_ = (uint)bVar13 * auVar103._16_4_ | (uint)!bVar13 * auVar111._16_4_;
            bVar13 = (bool)((byte)(uVar85 >> 5) & 1);
            auVar126._20_4_ = (uint)bVar13 * auVar103._20_4_ | (uint)!bVar13 * auVar111._20_4_;
            bVar13 = (bool)((byte)(uVar85 >> 6) & 1);
            auVar126._24_4_ = (uint)bVar13 * auVar103._24_4_ | (uint)!bVar13 * auVar111._24_4_;
            bVar13 = SUB81(uVar85 >> 7,0);
            auVar126._28_4_ = (uint)bVar13 * auVar103._28_4_ | (uint)!bVar13 * auVar111._28_4_;
            bVar13 = (bool)((byte)uVar85 & 1);
            auVar127._0_4_ = (float)((uint)bVar13 * auVar101._0_4_ | (uint)!bVar13 * auVar107._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
            auVar127._4_4_ = (float)((uint)bVar13 * auVar101._4_4_ | (uint)!bVar13 * auVar107._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
            auVar127._8_4_ = (float)((uint)bVar13 * auVar101._8_4_ | (uint)!bVar13 * auVar107._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
            auVar127._12_4_ =
                 (float)((uint)bVar13 * auVar101._12_4_ | (uint)!bVar13 * auVar107._12_4_);
            bVar13 = (bool)((byte)(uVar85 >> 4) & 1);
            auVar127._16_4_ =
                 (float)((uint)bVar13 * auVar101._16_4_ | (uint)!bVar13 * auVar107._16_4_);
            bVar13 = (bool)((byte)(uVar85 >> 5) & 1);
            auVar127._20_4_ =
                 (float)((uint)bVar13 * auVar101._20_4_ | (uint)!bVar13 * auVar107._20_4_);
            bVar13 = (bool)((byte)(uVar85 >> 6) & 1);
            auVar127._24_4_ =
                 (float)((uint)bVar13 * auVar101._24_4_ | (uint)!bVar13 * auVar107._24_4_);
            bVar13 = SUB81(uVar85 >> 7,0);
            auVar127._28_4_ = (uint)bVar13 * auVar101._28_4_ | (uint)!bVar13 * auVar107._28_4_;
            auVar196._8_4_ = 0x80000000;
            auVar196._0_8_ = 0x8000000080000000;
            auVar196._12_4_ = 0x80000000;
            auVar196._16_4_ = 0x80000000;
            auVar196._20_4_ = 0x80000000;
            auVar196._24_4_ = 0x80000000;
            auVar196._28_4_ = 0x80000000;
            auVar113 = vxorps_avx512vl(auVar126,auVar196);
            auVar107 = auVar213._0_32_;
            auVar115 = vfmadd213ps_avx512vl(auVar124,auVar124,auVar107);
            auVar212 = vfmadd231ps_fma(auVar115,auVar125,auVar125);
            auVar115 = vrsqrt14ps_avx512vl(ZEXT1632(auVar212));
            auVar207._8_4_ = 0xbf000000;
            auVar207._0_8_ = 0xbf000000bf000000;
            auVar207._12_4_ = 0xbf000000;
            auVar207._16_4_ = 0xbf000000;
            auVar207._20_4_ = 0xbf000000;
            auVar207._24_4_ = 0xbf000000;
            auVar207._28_4_ = 0xbf000000;
            fVar171 = auVar115._0_4_;
            fVar178 = auVar115._4_4_;
            fVar179 = auVar115._8_4_;
            fVar180 = auVar115._12_4_;
            fVar164 = auVar115._16_4_;
            fVar170 = auVar115._20_4_;
            fVar86 = auVar115._24_4_;
            auVar48._4_4_ = fVar178 * fVar178 * fVar178 * auVar212._4_4_ * -0.5;
            auVar48._0_4_ = fVar171 * fVar171 * fVar171 * auVar212._0_4_ * -0.5;
            auVar48._8_4_ = fVar179 * fVar179 * fVar179 * auVar212._8_4_ * -0.5;
            auVar48._12_4_ = fVar180 * fVar180 * fVar180 * auVar212._12_4_ * -0.5;
            auVar48._16_4_ = fVar164 * fVar164 * fVar164 * -0.0;
            auVar48._20_4_ = fVar170 * fVar170 * fVar170 * -0.0;
            auVar48._24_4_ = fVar86 * fVar86 * fVar86 * -0.0;
            auVar48._28_4_ = auVar125._28_4_;
            auVar111 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar115 = vfmadd231ps_avx512vl(auVar48,auVar111,auVar115);
            auVar49._4_4_ = auVar125._4_4_ * auVar115._4_4_;
            auVar49._0_4_ = auVar125._0_4_ * auVar115._0_4_;
            auVar49._8_4_ = auVar125._8_4_ * auVar115._8_4_;
            auVar49._12_4_ = auVar125._12_4_ * auVar115._12_4_;
            auVar49._16_4_ = auVar125._16_4_ * auVar115._16_4_;
            auVar49._20_4_ = auVar125._20_4_ * auVar115._20_4_;
            auVar49._24_4_ = auVar125._24_4_ * auVar115._24_4_;
            auVar49._28_4_ = 0;
            auVar50._4_4_ = auVar115._4_4_ * -auVar124._4_4_;
            auVar50._0_4_ = auVar115._0_4_ * -auVar124._0_4_;
            auVar50._8_4_ = auVar115._8_4_ * -auVar124._8_4_;
            auVar50._12_4_ = auVar115._12_4_ * -auVar124._12_4_;
            auVar50._16_4_ = auVar115._16_4_ * -auVar124._16_4_;
            auVar50._20_4_ = auVar115._20_4_ * -auVar124._20_4_;
            auVar50._24_4_ = auVar115._24_4_ * -auVar124._24_4_;
            auVar50._28_4_ = auVar125._28_4_;
            auVar110 = vmulps_avx512vl(auVar115,auVar107);
            auVar115 = vfmadd213ps_avx512vl(auVar126,auVar126,auVar107);
            auVar115 = vfmadd231ps_avx512vl(auVar115,auVar127,auVar127);
            auVar109 = vrsqrt14ps_avx512vl(auVar115);
            auVar115 = vmulps_avx512vl(auVar115,auVar207);
            fVar171 = auVar109._0_4_;
            fVar178 = auVar109._4_4_;
            fVar179 = auVar109._8_4_;
            fVar180 = auVar109._12_4_;
            fVar164 = auVar109._16_4_;
            fVar170 = auVar109._20_4_;
            fVar86 = auVar109._24_4_;
            auVar51._4_4_ = fVar178 * fVar178 * fVar178 * auVar115._4_4_;
            auVar51._0_4_ = fVar171 * fVar171 * fVar171 * auVar115._0_4_;
            auVar51._8_4_ = fVar179 * fVar179 * fVar179 * auVar115._8_4_;
            auVar51._12_4_ = fVar180 * fVar180 * fVar180 * auVar115._12_4_;
            auVar51._16_4_ = fVar164 * fVar164 * fVar164 * auVar115._16_4_;
            auVar51._20_4_ = fVar170 * fVar170 * fVar170 * auVar115._20_4_;
            auVar51._24_4_ = fVar86 * fVar86 * fVar86 * auVar115._24_4_;
            auVar51._28_4_ = auVar115._28_4_;
            auVar115 = vfmadd231ps_avx512vl(auVar51,auVar111,auVar109);
            auVar52._4_4_ = auVar127._4_4_ * auVar115._4_4_;
            auVar52._0_4_ = auVar127._0_4_ * auVar115._0_4_;
            auVar52._8_4_ = auVar127._8_4_ * auVar115._8_4_;
            auVar52._12_4_ = auVar127._12_4_ * auVar115._12_4_;
            auVar52._16_4_ = auVar127._16_4_ * auVar115._16_4_;
            auVar52._20_4_ = auVar127._20_4_ * auVar115._20_4_;
            auVar52._24_4_ = auVar127._24_4_ * auVar115._24_4_;
            auVar52._28_4_ = auVar109._28_4_;
            auVar53._4_4_ = auVar115._4_4_ * auVar113._4_4_;
            auVar53._0_4_ = auVar115._0_4_ * auVar113._0_4_;
            auVar53._8_4_ = auVar115._8_4_ * auVar113._8_4_;
            auVar53._12_4_ = auVar115._12_4_ * auVar113._12_4_;
            auVar53._16_4_ = auVar115._16_4_ * auVar113._16_4_;
            auVar53._20_4_ = auVar115._20_4_ * auVar113._20_4_;
            auVar53._24_4_ = auVar115._24_4_ * auVar113._24_4_;
            auVar53._28_4_ = auVar113._28_4_;
            auVar113 = vmulps_avx512vl(auVar115,auVar107);
            auVar212 = vfmadd213ps_fma(auVar49,ZEXT1632(auVar92),auVar102);
            auVar115 = ZEXT1632(auVar92);
            auVar20 = vfmadd213ps_fma(auVar50,auVar115,auVar104);
            auVar111 = vfmadd213ps_avx512vl(auVar110,auVar115,auVar99);
            auVar109 = vfmadd213ps_avx512vl(auVar52,ZEXT1632(auVar91),auVar105);
            auVar25 = vfnmadd213ps_fma(auVar49,auVar115,auVar102);
            auVar100 = ZEXT1632(auVar91);
            auVar21 = vfmadd213ps_fma(auVar53,auVar100,auVar106);
            auVar93 = vfnmadd213ps_fma(auVar50,auVar115,auVar104);
            auVar22 = vfmadd213ps_fma(auVar113,auVar100,auVar98);
            auVar104 = ZEXT1632(auVar92);
            auVar95 = vfnmadd231ps_fma(auVar99,auVar104,auVar110);
            auVar94 = vfnmadd213ps_fma(auVar52,auVar100,auVar105);
            auVar29 = vfnmadd213ps_fma(auVar53,auVar100,auVar106);
            auVar30 = vfnmadd231ps_fma(auVar98,ZEXT1632(auVar91),auVar113);
            auVar98 = vsubps_avx512vl(auVar109,ZEXT1632(auVar25));
            auVar113 = vsubps_avx(ZEXT1632(auVar21),ZEXT1632(auVar93));
            auVar115 = vsubps_avx(ZEXT1632(auVar22),ZEXT1632(auVar95));
            auVar54._4_4_ = auVar113._4_4_ * auVar95._4_4_;
            auVar54._0_4_ = auVar113._0_4_ * auVar95._0_4_;
            auVar54._8_4_ = auVar113._8_4_ * auVar95._8_4_;
            auVar54._12_4_ = auVar113._12_4_ * auVar95._12_4_;
            auVar54._16_4_ = auVar113._16_4_ * 0.0;
            auVar54._20_4_ = auVar113._20_4_ * 0.0;
            auVar54._24_4_ = auVar113._24_4_ * 0.0;
            auVar54._28_4_ = auVar110._28_4_;
            auVar92 = vfmsub231ps_fma(auVar54,ZEXT1632(auVar93),auVar115);
            auVar55._4_4_ = auVar115._4_4_ * auVar25._4_4_;
            auVar55._0_4_ = auVar115._0_4_ * auVar25._0_4_;
            auVar55._8_4_ = auVar115._8_4_ * auVar25._8_4_;
            auVar55._12_4_ = auVar115._12_4_ * auVar25._12_4_;
            auVar55._16_4_ = auVar115._16_4_ * 0.0;
            auVar55._20_4_ = auVar115._20_4_ * 0.0;
            auVar55._24_4_ = auVar115._24_4_ * 0.0;
            auVar55._28_4_ = auVar115._28_4_;
            auVar23 = vfmsub231ps_fma(auVar55,ZEXT1632(auVar95),auVar98);
            auVar56._4_4_ = auVar93._4_4_ * auVar98._4_4_;
            auVar56._0_4_ = auVar93._0_4_ * auVar98._0_4_;
            auVar56._8_4_ = auVar93._8_4_ * auVar98._8_4_;
            auVar56._12_4_ = auVar93._12_4_ * auVar98._12_4_;
            auVar56._16_4_ = auVar98._16_4_ * 0.0;
            auVar56._20_4_ = auVar98._20_4_ * 0.0;
            auVar56._24_4_ = auVar98._24_4_ * 0.0;
            auVar56._28_4_ = auVar98._28_4_;
            auVar24 = vfmsub231ps_fma(auVar56,ZEXT1632(auVar25),auVar113);
            auVar113 = vfmadd231ps_avx512vl(ZEXT1632(auVar24),auVar107,ZEXT1632(auVar23));
            auVar113 = vfmadd231ps_avx512vl(auVar113,auVar107,ZEXT1632(auVar92));
            uVar85 = vcmpps_avx512vl(auVar113,auVar107,2);
            bVar76 = (byte)uVar85;
            fVar134 = (float)((uint)(bVar76 & 1) * auVar212._0_4_ |
                             (uint)!(bool)(bVar76 & 1) * auVar94._0_4_);
            bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
            fVar136 = (float)((uint)bVar13 * auVar212._4_4_ | (uint)!bVar13 * auVar94._4_4_);
            bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
            fVar139 = (float)((uint)bVar13 * auVar212._8_4_ | (uint)!bVar13 * auVar94._8_4_);
            bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
            fVar140 = (float)((uint)bVar13 * auVar212._12_4_ | (uint)!bVar13 * auVar94._12_4_);
            auVar100 = ZEXT1632(CONCAT412(fVar140,CONCAT48(fVar139,CONCAT44(fVar136,fVar134))));
            fVar135 = (float)((uint)(bVar76 & 1) * auVar20._0_4_ |
                             (uint)!(bool)(bVar76 & 1) * auVar29._0_4_);
            bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
            fVar138 = (float)((uint)bVar13 * auVar20._4_4_ | (uint)!bVar13 * auVar29._4_4_);
            bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
            fVar137 = (float)((uint)bVar13 * auVar20._8_4_ | (uint)!bVar13 * auVar29._8_4_);
            bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
            fVar141 = (float)((uint)bVar13 * auVar20._12_4_ | (uint)!bVar13 * auVar29._12_4_);
            auVar103 = ZEXT1632(CONCAT412(fVar141,CONCAT48(fVar137,CONCAT44(fVar138,fVar135))));
            auVar128._0_4_ =
                 (float)((uint)(bVar76 & 1) * auVar111._0_4_ |
                        (uint)!(bool)(bVar76 & 1) * auVar30._0_4_);
            bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
            auVar128._4_4_ = (float)((uint)bVar13 * auVar111._4_4_ | (uint)!bVar13 * auVar30._4_4_);
            bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
            auVar128._8_4_ = (float)((uint)bVar13 * auVar111._8_4_ | (uint)!bVar13 * auVar30._8_4_);
            bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
            auVar128._12_4_ =
                 (float)((uint)bVar13 * auVar111._12_4_ | (uint)!bVar13 * auVar30._12_4_);
            fVar179 = (float)((uint)((byte)(uVar85 >> 4) & 1) * auVar111._16_4_);
            auVar128._16_4_ = fVar179;
            fVar171 = (float)((uint)((byte)(uVar85 >> 5) & 1) * auVar111._20_4_);
            auVar128._20_4_ = fVar171;
            fVar178 = (float)((uint)((byte)(uVar85 >> 6) & 1) * auVar111._24_4_);
            auVar128._24_4_ = fVar178;
            iVar1 = (uint)(byte)(uVar85 >> 7) * auVar111._28_4_;
            auVar128._28_4_ = iVar1;
            auVar113 = vblendmps_avx512vl(ZEXT1632(auVar25),auVar109);
            auVar129._0_4_ =
                 (uint)(bVar76 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar92._0_4_;
            bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
            auVar129._4_4_ = (uint)bVar13 * auVar113._4_4_ | (uint)!bVar13 * auVar92._4_4_;
            bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
            auVar129._8_4_ = (uint)bVar13 * auVar113._8_4_ | (uint)!bVar13 * auVar92._8_4_;
            bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
            auVar129._12_4_ = (uint)bVar13 * auVar113._12_4_ | (uint)!bVar13 * auVar92._12_4_;
            auVar129._16_4_ = (uint)((byte)(uVar85 >> 4) & 1) * auVar113._16_4_;
            auVar129._20_4_ = (uint)((byte)(uVar85 >> 5) & 1) * auVar113._20_4_;
            auVar129._24_4_ = (uint)((byte)(uVar85 >> 6) & 1) * auVar113._24_4_;
            auVar129._28_4_ = (uint)(byte)(uVar85 >> 7) * auVar113._28_4_;
            auVar113 = vblendmps_avx512vl(ZEXT1632(auVar93),ZEXT1632(auVar21));
            auVar130._0_4_ =
                 (float)((uint)(bVar76 & 1) * auVar113._0_4_ |
                        (uint)!(bool)(bVar76 & 1) * auVar212._0_4_);
            bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
            auVar130._4_4_ = (float)((uint)bVar13 * auVar113._4_4_ | (uint)!bVar13 * auVar212._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
            auVar130._8_4_ = (float)((uint)bVar13 * auVar113._8_4_ | (uint)!bVar13 * auVar212._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
            auVar130._12_4_ =
                 (float)((uint)bVar13 * auVar113._12_4_ | (uint)!bVar13 * auVar212._12_4_);
            fVar170 = (float)((uint)((byte)(uVar85 >> 4) & 1) * auVar113._16_4_);
            auVar130._16_4_ = fVar170;
            fVar180 = (float)((uint)((byte)(uVar85 >> 5) & 1) * auVar113._20_4_);
            auVar130._20_4_ = fVar180;
            fVar164 = (float)((uint)((byte)(uVar85 >> 6) & 1) * auVar113._24_4_);
            auVar130._24_4_ = fVar164;
            auVar130._28_4_ = (uint)(byte)(uVar85 >> 7) * auVar113._28_4_;
            auVar113 = vblendmps_avx512vl(ZEXT1632(auVar95),ZEXT1632(auVar22));
            auVar131._0_4_ =
                 (float)((uint)(bVar76 & 1) * auVar113._0_4_ |
                        (uint)!(bool)(bVar76 & 1) * auVar20._0_4_);
            bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
            auVar131._4_4_ = (float)((uint)bVar13 * auVar113._4_4_ | (uint)!bVar13 * auVar20._4_4_);
            bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
            auVar131._8_4_ = (float)((uint)bVar13 * auVar113._8_4_ | (uint)!bVar13 * auVar20._8_4_);
            bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
            auVar131._12_4_ =
                 (float)((uint)bVar13 * auVar113._12_4_ | (uint)!bVar13 * auVar20._12_4_);
            fVar86 = (float)((uint)((byte)(uVar85 >> 4) & 1) * auVar113._16_4_);
            auVar131._16_4_ = fVar86;
            fVar87 = (float)((uint)((byte)(uVar85 >> 5) & 1) * auVar113._20_4_);
            auVar131._20_4_ = fVar87;
            fVar133 = (float)((uint)((byte)(uVar85 >> 6) & 1) * auVar113._24_4_);
            auVar131._24_4_ = fVar133;
            iVar2 = (uint)(byte)(uVar85 >> 7) * auVar113._28_4_;
            auVar131._28_4_ = iVar2;
            auVar132._0_4_ =
                 (uint)(bVar76 & 1) * (int)auVar25._0_4_ |
                 (uint)!(bool)(bVar76 & 1) * auVar109._0_4_;
            bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
            auVar132._4_4_ = (uint)bVar13 * (int)auVar25._4_4_ | (uint)!bVar13 * auVar109._4_4_;
            bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
            auVar132._8_4_ = (uint)bVar13 * (int)auVar25._8_4_ | (uint)!bVar13 * auVar109._8_4_;
            bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
            auVar132._12_4_ = (uint)bVar13 * (int)auVar25._12_4_ | (uint)!bVar13 * auVar109._12_4_;
            auVar132._16_4_ = (uint)!(bool)((byte)(uVar85 >> 4) & 1) * auVar109._16_4_;
            auVar132._20_4_ = (uint)!(bool)((byte)(uVar85 >> 5) & 1) * auVar109._20_4_;
            auVar132._24_4_ = (uint)!(bool)((byte)(uVar85 >> 6) & 1) * auVar109._24_4_;
            auVar132._28_4_ = (uint)!SUB81(uVar85 >> 7,0) * auVar109._28_4_;
            bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar85 >> 2) & 1);
            bVar17 = (bool)((byte)(uVar85 >> 3) & 1);
            bVar14 = (bool)((byte)(uVar85 >> 1) & 1);
            bVar16 = (bool)((byte)(uVar85 >> 2) & 1);
            bVar18 = (bool)((byte)(uVar85 >> 3) & 1);
            auVar109 = vsubps_avx512vl(auVar132,auVar100);
            auVar115 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar93._12_4_ |
                                                     (uint)!bVar17 * auVar21._12_4_,
                                                     CONCAT48((uint)bVar15 * (int)auVar93._8_4_ |
                                                              (uint)!bVar15 * auVar21._8_4_,
                                                              CONCAT44((uint)bVar13 *
                                                                       (int)auVar93._4_4_ |
                                                                       (uint)!bVar13 * auVar21._4_4_
                                                                       ,(uint)(bVar76 & 1) *
                                                                        (int)auVar93._0_4_ |
                                                                        (uint)!(bool)(bVar76 & 1) *
                                                                        auVar21._0_4_)))),auVar103);
            auVar111 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar95._12_4_ |
                                                     (uint)!bVar18 * auVar22._12_4_,
                                                     CONCAT48((uint)bVar16 * (int)auVar95._8_4_ |
                                                              (uint)!bVar16 * auVar22._8_4_,
                                                              CONCAT44((uint)bVar14 *
                                                                       (int)auVar95._4_4_ |
                                                                       (uint)!bVar14 * auVar22._4_4_
                                                                       ,(uint)(bVar76 & 1) *
                                                                        (int)auVar95._0_4_ |
                                                                        (uint)!(bool)(bVar76 & 1) *
                                                                        auVar22._0_4_)))),auVar128);
            auVar110 = vsubps_avx(auVar100,auVar129);
            auVar98 = vsubps_avx(auVar103,auVar130);
            auVar99 = vsubps_avx(auVar128,auVar131);
            auVar57._4_4_ = auVar111._4_4_ * fVar136;
            auVar57._0_4_ = auVar111._0_4_ * fVar134;
            auVar57._8_4_ = auVar111._8_4_ * fVar139;
            auVar57._12_4_ = auVar111._12_4_ * fVar140;
            auVar57._16_4_ = auVar111._16_4_ * 0.0;
            auVar57._20_4_ = auVar111._20_4_ * 0.0;
            auVar57._24_4_ = auVar111._24_4_ * 0.0;
            auVar57._28_4_ = 0;
            auVar92 = vfmsub231ps_fma(auVar57,auVar128,auVar109);
            auVar169._0_4_ = fVar135 * auVar109._0_4_;
            auVar169._4_4_ = fVar138 * auVar109._4_4_;
            auVar169._8_4_ = fVar137 * auVar109._8_4_;
            auVar169._12_4_ = fVar141 * auVar109._12_4_;
            auVar169._16_4_ = auVar109._16_4_ * 0.0;
            auVar169._20_4_ = auVar109._20_4_ * 0.0;
            auVar169._24_4_ = auVar109._24_4_ * 0.0;
            auVar169._28_4_ = 0;
            auVar212 = vfmsub231ps_fma(auVar169,auVar100,auVar115);
            auVar113 = vfmadd231ps_avx512vl(ZEXT1632(auVar212),auVar107,ZEXT1632(auVar92));
            auVar176._0_4_ = auVar115._0_4_ * auVar128._0_4_;
            auVar176._4_4_ = auVar115._4_4_ * auVar128._4_4_;
            auVar176._8_4_ = auVar115._8_4_ * auVar128._8_4_;
            auVar176._12_4_ = auVar115._12_4_ * auVar128._12_4_;
            auVar176._16_4_ = auVar115._16_4_ * fVar179;
            auVar176._20_4_ = auVar115._20_4_ * fVar171;
            auVar176._24_4_ = auVar115._24_4_ * fVar178;
            auVar176._28_4_ = 0;
            auVar92 = vfmsub231ps_fma(auVar176,auVar103,auVar111);
            auVar101 = vfmadd231ps_avx512vl(auVar113,auVar107,ZEXT1632(auVar92));
            auVar113 = vmulps_avx512vl(auVar99,auVar129);
            auVar113 = vfmsub231ps_avx512vl(auVar113,auVar110,auVar131);
            auVar58._4_4_ = auVar98._4_4_ * auVar131._4_4_;
            auVar58._0_4_ = auVar98._0_4_ * auVar131._0_4_;
            auVar58._8_4_ = auVar98._8_4_ * auVar131._8_4_;
            auVar58._12_4_ = auVar98._12_4_ * auVar131._12_4_;
            auVar58._16_4_ = auVar98._16_4_ * fVar86;
            auVar58._20_4_ = auVar98._20_4_ * fVar87;
            auVar58._24_4_ = auVar98._24_4_ * fVar133;
            auVar58._28_4_ = iVar2;
            auVar92 = vfmsub231ps_fma(auVar58,auVar130,auVar99);
            auVar177._0_4_ = auVar130._0_4_ * auVar110._0_4_;
            auVar177._4_4_ = auVar130._4_4_ * auVar110._4_4_;
            auVar177._8_4_ = auVar130._8_4_ * auVar110._8_4_;
            auVar177._12_4_ = auVar130._12_4_ * auVar110._12_4_;
            auVar177._16_4_ = fVar170 * auVar110._16_4_;
            auVar177._20_4_ = fVar180 * auVar110._20_4_;
            auVar177._24_4_ = fVar164 * auVar110._24_4_;
            auVar177._28_4_ = 0;
            auVar212 = vfmsub231ps_fma(auVar177,auVar98,auVar129);
            auVar113 = vfmadd231ps_avx512vl(ZEXT1632(auVar212),auVar107,auVar113);
            auVar102 = vfmadd231ps_avx512vl(auVar113,auVar107,ZEXT1632(auVar92));
            auVar113 = vmaxps_avx(auVar101,auVar102);
            uVar143 = vcmpps_avx512vl(auVar113,auVar107,2);
            local_250 = local_250 & (byte)uVar143;
            if (local_250 == 0) {
LAB_01c85272:
              local_250 = 0;
            }
            else {
              auVar59._4_4_ = auVar99._4_4_ * auVar115._4_4_;
              auVar59._0_4_ = auVar99._0_4_ * auVar115._0_4_;
              auVar59._8_4_ = auVar99._8_4_ * auVar115._8_4_;
              auVar59._12_4_ = auVar99._12_4_ * auVar115._12_4_;
              auVar59._16_4_ = auVar99._16_4_ * auVar115._16_4_;
              auVar59._20_4_ = auVar99._20_4_ * auVar115._20_4_;
              auVar59._24_4_ = auVar99._24_4_ * auVar115._24_4_;
              auVar59._28_4_ = auVar113._28_4_;
              auVar20 = vfmsub231ps_fma(auVar59,auVar98,auVar111);
              auVar60._4_4_ = auVar111._4_4_ * auVar110._4_4_;
              auVar60._0_4_ = auVar111._0_4_ * auVar110._0_4_;
              auVar60._8_4_ = auVar111._8_4_ * auVar110._8_4_;
              auVar60._12_4_ = auVar111._12_4_ * auVar110._12_4_;
              auVar60._16_4_ = auVar111._16_4_ * auVar110._16_4_;
              auVar60._20_4_ = auVar111._20_4_ * auVar110._20_4_;
              auVar60._24_4_ = auVar111._24_4_ * auVar110._24_4_;
              auVar60._28_4_ = auVar111._28_4_;
              auVar212 = vfmsub231ps_fma(auVar60,auVar109,auVar99);
              auVar61._4_4_ = auVar98._4_4_ * auVar109._4_4_;
              auVar61._0_4_ = auVar98._0_4_ * auVar109._0_4_;
              auVar61._8_4_ = auVar98._8_4_ * auVar109._8_4_;
              auVar61._12_4_ = auVar98._12_4_ * auVar109._12_4_;
              auVar61._16_4_ = auVar98._16_4_ * auVar109._16_4_;
              auVar61._20_4_ = auVar98._20_4_ * auVar109._20_4_;
              auVar61._24_4_ = auVar98._24_4_ * auVar109._24_4_;
              auVar61._28_4_ = auVar98._28_4_;
              auVar21 = vfmsub231ps_fma(auVar61,auVar110,auVar115);
              auVar92 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar212),ZEXT1632(auVar21));
              auVar113 = vfmadd231ps_avx512vl(ZEXT1632(auVar92),ZEXT1632(auVar20),auVar107);
              auVar115 = vrcp14ps_avx512vl(auVar113);
              auVar36._8_4_ = 0x3f800000;
              auVar36._0_8_ = &DAT_3f8000003f800000;
              auVar36._12_4_ = 0x3f800000;
              auVar36._16_4_ = 0x3f800000;
              auVar36._20_4_ = 0x3f800000;
              auVar36._24_4_ = 0x3f800000;
              auVar36._28_4_ = 0x3f800000;
              auVar111 = vfnmadd213ps_avx512vl(auVar115,auVar113,auVar36);
              auVar92 = vfmadd132ps_fma(auVar111,auVar115,auVar115);
              auVar62._4_4_ = auVar21._4_4_ * auVar128._4_4_;
              auVar62._0_4_ = auVar21._0_4_ * auVar128._0_4_;
              auVar62._8_4_ = auVar21._8_4_ * auVar128._8_4_;
              auVar62._12_4_ = auVar21._12_4_ * auVar128._12_4_;
              auVar62._16_4_ = fVar179 * 0.0;
              auVar62._20_4_ = fVar171 * 0.0;
              auVar62._24_4_ = fVar178 * 0.0;
              auVar62._28_4_ = iVar1;
              auVar212 = vfmadd231ps_fma(auVar62,auVar103,ZEXT1632(auVar212));
              auVar212 = vfmadd231ps_fma(ZEXT1632(auVar212),auVar100,ZEXT1632(auVar20));
              fVar171 = auVar92._0_4_;
              fVar178 = auVar92._4_4_;
              fVar179 = auVar92._8_4_;
              fVar180 = auVar92._12_4_;
              auVar115 = ZEXT1632(CONCAT412(auVar212._12_4_ * fVar180,
                                            CONCAT48(auVar212._8_4_ * fVar179,
                                                     CONCAT44(auVar212._4_4_ * fVar178,
                                                              auVar212._0_4_ * fVar171))));
              auVar74._4_4_ = uStack_1dc;
              auVar74._0_4_ = local_1e0;
              auVar74._8_4_ = uStack_1d8;
              auVar74._12_4_ = uStack_1d4;
              auVar74._16_4_ = uStack_1d0;
              auVar74._20_4_ = uStack_1cc;
              auVar74._24_4_ = uStack_1c8;
              auVar74._28_4_ = uStack_1c4;
              uVar143 = vcmpps_avx512vl(auVar115,auVar74,0xd);
              uVar142 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar37._4_4_ = uVar142;
              auVar37._0_4_ = uVar142;
              auVar37._8_4_ = uVar142;
              auVar37._12_4_ = uVar142;
              auVar37._16_4_ = uVar142;
              auVar37._20_4_ = uVar142;
              auVar37._24_4_ = uVar142;
              auVar37._28_4_ = uVar142;
              uVar26 = vcmpps_avx512vl(auVar115,auVar37,2);
              local_250 = (byte)uVar143 & (byte)uVar26 & local_250;
              if (local_250 == 0) goto LAB_01c85272;
              uVar143 = vcmpps_avx512vl(auVar113,auVar107,4);
              if ((local_250 & (byte)uVar143) == 0) goto LAB_01c85272;
              local_250 = local_250 & (byte)uVar143;
              fVar164 = auVar101._0_4_ * fVar171;
              fVar170 = auVar101._4_4_ * fVar178;
              auVar63._4_4_ = fVar170;
              auVar63._0_4_ = fVar164;
              fVar86 = auVar101._8_4_ * fVar179;
              auVar63._8_4_ = fVar86;
              fVar87 = auVar101._12_4_ * fVar180;
              auVar63._12_4_ = fVar87;
              fVar133 = auVar101._16_4_ * 0.0;
              auVar63._16_4_ = fVar133;
              fVar134 = auVar101._20_4_ * 0.0;
              auVar63._20_4_ = fVar134;
              fVar135 = auVar101._24_4_ * 0.0;
              auVar63._24_4_ = fVar135;
              auVar63._28_4_ = auVar101._28_4_;
              fVar171 = auVar102._0_4_ * fVar171;
              fVar178 = auVar102._4_4_ * fVar178;
              auVar64._4_4_ = fVar178;
              auVar64._0_4_ = fVar171;
              fVar179 = auVar102._8_4_ * fVar179;
              auVar64._8_4_ = fVar179;
              fVar180 = auVar102._12_4_ * fVar180;
              auVar64._12_4_ = fVar180;
              fVar136 = auVar102._16_4_ * 0.0;
              auVar64._16_4_ = fVar136;
              fVar138 = auVar102._20_4_ * 0.0;
              auVar64._20_4_ = fVar138;
              fVar139 = auVar102._24_4_ * 0.0;
              auVar64._24_4_ = fVar139;
              auVar64._28_4_ = auVar102._28_4_;
              auVar187._8_4_ = 0x3f800000;
              auVar187._0_8_ = &DAT_3f8000003f800000;
              auVar187._12_4_ = 0x3f800000;
              auVar187._16_4_ = 0x3f800000;
              auVar187._20_4_ = 0x3f800000;
              auVar187._24_4_ = 0x3f800000;
              auVar187._28_4_ = 0x3f800000;
              auVar113 = vsubps_avx(auVar187,auVar63);
              local_560._0_4_ =
                   (uint)(bVar76 & 1) * (int)fVar164 | (uint)!(bool)(bVar76 & 1) * auVar113._0_4_;
              bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
              local_560._4_4_ = (uint)bVar13 * (int)fVar170 | (uint)!bVar13 * auVar113._4_4_;
              bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
              local_560._8_4_ = (uint)bVar13 * (int)fVar86 | (uint)!bVar13 * auVar113._8_4_;
              bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
              local_560._12_4_ = (uint)bVar13 * (int)fVar87 | (uint)!bVar13 * auVar113._12_4_;
              bVar13 = (bool)((byte)(uVar85 >> 4) & 1);
              local_560._16_4_ = (uint)bVar13 * (int)fVar133 | (uint)!bVar13 * auVar113._16_4_;
              bVar13 = (bool)((byte)(uVar85 >> 5) & 1);
              local_560._20_4_ = (uint)bVar13 * (int)fVar134 | (uint)!bVar13 * auVar113._20_4_;
              bVar13 = (bool)((byte)(uVar85 >> 6) & 1);
              local_560._24_4_ = (uint)bVar13 * (int)fVar135 | (uint)!bVar13 * auVar113._24_4_;
              bVar13 = SUB81(uVar85 >> 7,0);
              local_560._28_4_ = (uint)bVar13 * auVar101._28_4_ | (uint)!bVar13 * auVar113._28_4_;
              auVar113 = vsubps_avx(auVar187,auVar64);
              bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
              bVar14 = (bool)((byte)(uVar85 >> 2) & 1);
              bVar15 = (bool)((byte)(uVar85 >> 3) & 1);
              bVar16 = (bool)((byte)(uVar85 >> 4) & 1);
              bVar17 = (bool)((byte)(uVar85 >> 5) & 1);
              bVar18 = (bool)((byte)(uVar85 >> 6) & 1);
              bVar19 = SUB81(uVar85 >> 7,0);
              local_1c0._4_4_ = (uint)bVar13 * (int)fVar178 | (uint)!bVar13 * auVar113._4_4_;
              local_1c0._0_4_ =
                   (uint)(bVar76 & 1) * (int)fVar171 | (uint)!(bool)(bVar76 & 1) * auVar113._0_4_;
              local_1c0._8_4_ = (uint)bVar14 * (int)fVar179 | (uint)!bVar14 * auVar113._8_4_;
              local_1c0._12_4_ = (uint)bVar15 * (int)fVar180 | (uint)!bVar15 * auVar113._12_4_;
              local_1c0._16_4_ = (uint)bVar16 * (int)fVar136 | (uint)!bVar16 * auVar113._16_4_;
              local_1c0._20_4_ = (uint)bVar17 * (int)fVar138 | (uint)!bVar17 * auVar113._20_4_;
              local_1c0._24_4_ = (uint)bVar18 * (int)fVar139 | (uint)!bVar18 * auVar113._24_4_;
              local_1c0._28_4_ = (uint)bVar19 * auVar102._28_4_ | (uint)!bVar19 * auVar113._28_4_;
              local_580 = auVar115;
            }
            if (local_250 != 0) {
              auVar113 = vsubps_avx(ZEXT1632(auVar91),auVar104);
              auVar92 = vfmadd213ps_fma(auVar113,local_560,auVar104);
              uVar142 = *(undefined4 *)((long)local_6a8->ray_space + k * 4 + -0x10);
              auVar38._4_4_ = uVar142;
              auVar38._0_4_ = uVar142;
              auVar38._8_4_ = uVar142;
              auVar38._12_4_ = uVar142;
              auVar38._16_4_ = uVar142;
              auVar38._20_4_ = uVar142;
              auVar38._24_4_ = uVar142;
              auVar38._28_4_ = uVar142;
              auVar113 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar92._12_4_ + auVar92._12_4_,
                                                            CONCAT48(auVar92._8_4_ + auVar92._8_4_,
                                                                     CONCAT44(auVar92._4_4_ +
                                                                              auVar92._4_4_,
                                                                              auVar92._0_4_ +
                                                                              auVar92._0_4_)))),
                                         auVar38);
              uVar143 = vcmpps_avx512vl(local_580,auVar113,6);
              local_250 = local_250 & (byte)uVar143;
              if (local_250 != 0) {
                auVar153._8_4_ = 0xbf800000;
                auVar153._0_8_ = 0xbf800000bf800000;
                auVar153._12_4_ = 0xbf800000;
                auVar153._16_4_ = 0xbf800000;
                auVar153._20_4_ = 0xbf800000;
                auVar153._24_4_ = 0xbf800000;
                auVar153._28_4_ = 0xbf800000;
                auVar39._8_4_ = 0x40000000;
                auVar39._0_8_ = 0x4000000040000000;
                auVar39._12_4_ = 0x40000000;
                auVar39._16_4_ = 0x40000000;
                auVar39._20_4_ = 0x40000000;
                auVar39._24_4_ = 0x40000000;
                auVar39._28_4_ = 0x40000000;
                local_2e0 = vfmadd132ps_avx512vl(local_1c0,auVar153,auVar39);
                local_1c0 = local_2e0;
                auVar113 = local_1c0;
                local_2a0 = (undefined4)lVar83;
                local_290 = local_610._0_8_;
                uStack_288 = local_610._8_8_;
                local_280 = local_460._0_8_;
                uStack_278 = local_460._8_8_;
                local_270 = local_470._0_8_;
                uStack_268 = local_470._8_8_;
                local_260 = local_450._0_8_;
                uStack_258 = local_450._8_8_;
                pGVar80 = (context->scene->geometries).items[local_6b8].ptr;
                if ((pGVar80->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  bVar76 = 0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar76 = 1, pGVar80->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_160 = vmovdqa64_avx512vl(auVar204._0_32_);
                  auVar92 = vcvtsi2ss_avx512f(auVar108._0_16_,local_2a0);
                  fVar171 = auVar92._0_4_;
                  local_240[0] = (fVar171 + local_560._0_4_ + 0.0) * (float)local_3c0;
                  local_240[1] = (fVar171 + local_560._4_4_ + 1.0) * local_3c0._4_4_;
                  local_240[2] = (fVar171 + local_560._8_4_ + 2.0) * fStack_3b8;
                  local_240[3] = (fVar171 + local_560._12_4_ + 3.0) * fStack_3b4;
                  fStack_230 = (fVar171 + local_560._16_4_ + 4.0) * fStack_3b0;
                  fStack_22c = (fVar171 + local_560._20_4_ + 5.0) * fStack_3ac;
                  fStack_228 = (fVar171 + local_560._24_4_ + 6.0) * fStack_3a8;
                  fStack_224 = fVar171 + local_560._28_4_ + 7.0;
                  local_1c0._0_8_ = local_2e0._0_8_;
                  local_1c0._8_8_ = local_2e0._8_8_;
                  local_1c0._16_8_ = local_2e0._16_8_;
                  local_1c0._24_8_ = local_2e0._24_8_;
                  local_220 = local_1c0._0_8_;
                  uStack_218 = local_1c0._8_8_;
                  uStack_210 = local_1c0._16_8_;
                  uStack_208 = local_1c0._24_8_;
                  local_200 = local_580;
                  local_5a0 = local_460._0_8_;
                  uStack_598 = local_460._8_8_;
                  uVar85 = 0;
                  uVar78 = (ulong)local_250;
                  for (uVar79 = uVar78; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000
                      ) {
                    uVar85 = uVar85 + 1;
                  }
                  local_5b0 = local_470._0_4_;
                  fStack_5ac = local_470._4_4_;
                  fStack_5a8 = local_470._8_4_;
                  fStack_5a4 = local_470._12_4_;
                  _local_670 = local_450;
                  local_660._0_4_ = 1;
                  local_6b0 = pGVar80;
                  local_300 = local_560;
                  local_2c0 = local_580;
                  local_29c = iVar8;
                  local_1c0 = auVar113;
                  do {
                    local_650 = *(undefined4 *)(ray + k * 4 + 0x80);
                    local_360 = local_240[uVar85];
                    local_350 = *(undefined4 *)((long)&local_220 + uVar85 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_200 + uVar85 * 4);
                    local_6a0.context = context->user;
                    fVar178 = 1.0 - local_360;
                    fVar171 = fVar178 * fVar178 * -3.0;
                    auVar92 = vfmadd231ss_fma(ZEXT416((uint)(fVar178 * fVar178)),
                                              ZEXT416((uint)(local_360 * fVar178)),
                                              ZEXT416(0xc0000000));
                    auVar91 = vfmsub132ss_fma(ZEXT416((uint)(local_360 * fVar178)),
                                              ZEXT416((uint)(local_360 * local_360)),
                                              ZEXT416(0x40000000));
                    fVar178 = auVar92._0_4_ * 3.0;
                    fVar179 = auVar91._0_4_ * 3.0;
                    fVar180 = local_360 * local_360 * 3.0;
                    auVar185._0_4_ = fVar180 * (float)local_670._0_4_;
                    auVar185._4_4_ = fVar180 * (float)local_670._4_4_;
                    auVar185._8_4_ = fVar180 * fStack_668;
                    auVar185._12_4_ = fVar180 * fStack_664;
                    auVar150._4_4_ = fVar179;
                    auVar150._0_4_ = fVar179;
                    auVar150._8_4_ = fVar179;
                    auVar150._12_4_ = fVar179;
                    auVar70._4_4_ = fStack_5ac;
                    auVar70._0_4_ = local_5b0;
                    auVar70._8_4_ = fStack_5a8;
                    auVar70._12_4_ = fStack_5a4;
                    auVar92 = vfmadd132ps_fma(auVar150,auVar185,auVar70);
                    auVar168._4_4_ = fVar178;
                    auVar168._0_4_ = fVar178;
                    auVar168._8_4_ = fVar178;
                    auVar168._12_4_ = fVar178;
                    auVar72._8_8_ = uStack_598;
                    auVar72._0_8_ = local_5a0;
                    auVar92 = vfmadd132ps_fma(auVar168,auVar92,auVar72);
                    auVar151._4_4_ = fVar171;
                    auVar151._0_4_ = fVar171;
                    auVar151._8_4_ = fVar171;
                    auVar151._12_4_ = fVar171;
                    auVar92 = vfmadd132ps_fma(auVar151,auVar92,local_610);
                    local_390 = auVar92._0_4_;
                    local_380 = vshufps_avx(auVar92,auVar92,0x55);
                    local_370 = vshufps_avx(auVar92,auVar92,0xaa);
                    local_340 = local_620._0_8_;
                    uStack_338 = local_620._8_8_;
                    local_330 = local_630;
                    vpcmpeqd_avx2(ZEXT1632(local_630),ZEXT1632(local_630));
                    uStack_31c = (local_6a0.context)->instID[0];
                    local_320 = uStack_31c;
                    uStack_318 = uStack_31c;
                    uStack_314 = uStack_31c;
                    uStack_310 = (local_6a0.context)->instPrimID[0];
                    uStack_30c = uStack_310;
                    uStack_308 = uStack_310;
                    uStack_304 = uStack_310;
                    local_6d0 = local_480._0_8_;
                    uStack_6c8 = local_480._8_8_;
                    local_6a0.valid = (int *)&local_6d0;
                    local_6a0.geometryUserPtr = pGVar80->userPtr;
                    local_6a0.hit = (RTCHitN *)&local_390;
                    local_6a0.N = 4;
                    pRVar75 = (RayK<4> *)pGVar80->occlusionFilterN;
                    local_640._0_8_ = uVar85;
                    uVar79 = uVar85;
                    local_6a0.ray = (RTCRayN *)ray;
                    uStack_38c = local_390;
                    uStack_388 = local_390;
                    uStack_384 = local_390;
                    fStack_35c = local_360;
                    fStack_358 = local_360;
                    fStack_354 = local_360;
                    uStack_34c = local_350;
                    uStack_348 = local_350;
                    uStack_344 = local_350;
                    if (pRVar75 != (RayK<4> *)0x0) {
                      pRVar75 = (RayK<4> *)(*(code *)pRVar75)(&local_6a0);
                      uVar79 = local_640._0_8_;
                      pGVar80 = local_6b0;
                    }
                    auVar67._8_8_ = uStack_6c8;
                    auVar67._0_8_ = local_6d0;
                    uVar85 = vptestmd_avx512vl(auVar67,auVar67);
                    if ((uVar85 & 0xf) != 0) {
                      p_Var12 = context->args->filter;
                      if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar80->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var12)(&local_6a0);
                        uVar79 = local_640._0_8_;
                        pGVar80 = local_6b0;
                      }
                      auVar212 = auVar213._0_16_;
                      auVar68._8_8_ = uStack_6c8;
                      auVar68._0_8_ = local_6d0;
                      auVar92 = *(undefined1 (*) [16])(local_6a0.ray + 0x80);
                      uVar85 = vptestmd_avx512vl(auVar68,auVar68);
                      uVar85 = uVar85 & 0xf;
                      auVar91 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar13 = (bool)((byte)uVar85 & 1);
                      auVar97._0_4_ = (uint)bVar13 * auVar91._0_4_ | (uint)!bVar13 * auVar92._0_4_;
                      bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
                      auVar97._4_4_ = (uint)bVar13 * auVar91._4_4_ | (uint)!bVar13 * auVar92._4_4_;
                      bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
                      auVar97._8_4_ = (uint)bVar13 * auVar91._8_4_ | (uint)!bVar13 * auVar92._8_4_;
                      bVar13 = SUB81(uVar85 >> 3,0);
                      auVar97._12_4_ =
                           (uint)bVar13 * auVar91._12_4_ | (uint)!bVar13 * auVar92._12_4_;
                      *(undefined1 (*) [16])(local_6a0.ray + 0x80) = auVar97;
                      pRVar75 = (RayK<4> *)local_6a0.ray;
                      if ((byte)uVar85 != 0) break;
                    }
                    auVar212 = auVar213._0_16_;
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_650;
                    uVar85 = 0;
                    uVar78 = uVar78 ^ 1L << (uVar79 & 0x3f);
                    for (uVar79 = uVar78; (uVar79 & 1) == 0;
                        uVar79 = uVar79 >> 1 | 0x8000000000000000) {
                      uVar85 = uVar85 + 1;
                    }
                    local_660._0_4_ = (int)CONCAT71((int7)((ulong)pRVar75 >> 8),uVar78 != 0);
                  } while (uVar78 != 0);
                  bVar76 = local_660[0] & 1;
                  auVar92 = vxorps_avx512vl(auVar212,auVar212);
                  auVar213 = ZEXT1664(auVar92);
                  auVar209 = ZEXT3264(local_4a0);
                  auVar210 = ZEXT3264(local_3e0);
                  auVar211 = ZEXT3264(local_4c0);
                  auVar218 = ZEXT3264(local_400);
                  auVar214 = ZEXT3264(local_4e0);
                  auVar215 = ZEXT3264(local_500);
                  auVar216 = ZEXT3264(local_420);
                  auVar217 = ZEXT3264(local_440);
                  auVar113 = vmovdqa64_avx512vl(local_160);
                  auVar204 = ZEXT3264(auVar113);
                }
                bVar81 = (bool)(bVar81 | bVar76);
              }
            }
          }
          lVar83 = lVar83 + 8;
        } while ((int)lVar83 < iVar8);
      }
      if (bVar81 != false) {
        return local_6f1;
      }
      uVar142 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar32._4_4_ = uVar142;
      auVar32._0_4_ = uVar142;
      auVar32._8_4_ = uVar142;
      auVar32._12_4_ = uVar142;
      uVar143 = vcmpps_avx512vl(local_170,auVar32,2);
      uVar82 = (uint)uVar84 & (uint)uVar84 + 0xf & (uint)uVar143;
      uVar84 = (ulong)uVar82;
      local_6f1 = uVar82 != 0;
    } while (local_6f1);
  }
  return local_6f1;
}

Assistant:

static __forceinline bool occluded_h(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }